

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  optState_t *poVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ZSTD_OptPrice_e ZVar6;
  rawSeqStore_t *prVar7;
  ZSTD_match_t *pZVar8;
  undefined8 uVar9;
  ZSTD_optimal_t *pZVar10;
  U32 UVar11;
  U32 UVar12;
  U32 i;
  uint uVar13;
  U32 UVar14;
  U32 UVar15;
  uint uVar16;
  U32 UVar17;
  ulong *puVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  U32 *pUVar22;
  U32 *pUVar23;
  seqDef *psVar24;
  ulong *puVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  ZSTD_optimal_t *pZVar29;
  uint *puVar30;
  uint *puVar31;
  uint uVar32;
  ulong *puVar33;
  int *piVar34;
  ulong *puVar35;
  ulong *puVar36;
  uint uVar37;
  BYTE *base_1;
  uint uVar38;
  uint uVar39;
  ulong *puVar40;
  long lVar41;
  U32 *pUVar42;
  U32 UVar43;
  U32 *pUVar44;
  ulong *puVar45;
  ulong uVar46;
  ulong uVar47;
  ulong *puVar48;
  uint uVar49;
  BYTE *pStart;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  BYTE *pStart_9;
  uint uVar54;
  uint uVar55;
  BYTE *pStart_1;
  ulong uVar56;
  ulong *puVar57;
  BYTE *base;
  long lVar58;
  ZSTD_optimal_t *pZVar59;
  BYTE *base_2;
  ulong uVar60;
  BYTE *pBVar61;
  U32 *pUVar62;
  bool bVar63;
  int iVar64;
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 dummy32_3;
  U32 nextToUpdate3;
  U32 nbMatches;
  ulong *local_260;
  uint *local_258;
  ulong *local_250;
  uint *local_230;
  ulong *local_220;
  uint *local_210;
  uint *local_200;
  ulong *local_1f8;
  U32 *local_1e8;
  uint *local_1d0;
  uint *local_1c8;
  ulong *local_1c0;
  ulong *local_1b8;
  U32 local_1a4;
  undefined8 local_1a0;
  undefined8 local_198;
  ZSTD_optimal_t *local_190;
  U32 *local_188;
  undefined8 local_180;
  undefined8 local_178;
  ulong *local_170;
  ulong local_168;
  U32 local_160;
  ulong *local_158;
  undefined8 local_150;
  U32 local_144;
  undefined8 local_140;
  undefined8 local_138;
  ulong *local_130;
  ulong *local_128;
  ZSTD_optimal_t *local_120;
  undefined8 local_118;
  uint local_10c;
  uint *local_108;
  U32 *local_100;
  undefined8 local_f8;
  ulong local_f0;
  seqStore_t *local_e8;
  ulong *local_e0;
  ZSTD_optimal_t *local_d8;
  undefined8 local_d0;
  U32 local_c8;
  ulong local_c0;
  U32 *local_b8;
  ulong *local_b0;
  ulong *local_a8;
  uint local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  size_t local_78;
  undefined8 local_70;
  U32 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pBVar61 = (ms->window).base;
  puVar45 = (ulong *)src;
  local_128 = (ulong *)rep;
  local_e8 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar26 = (ms->window).dictLimit, uVar26 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar13 = (int)src - (int)pBVar61, uVar26 == uVar13)))) {
    local_160 = rep[2];
    local_168 = *(ulong *)rep;
    poVar2 = &ms->opt;
    local_130 = (ulong *)((long)src + (srcSize - 8));
    uVar26 = (ms->cParams).targetLength;
    uVar37 = 0xfff;
    if (uVar26 < 0xfff) {
      uVar37 = uVar26;
    }
    local_118 = (U32 *)CONCAT44(local_118._4_4_,uVar37);
    uVar26 = (ms->cParams).minMatch;
    local_144 = ms->nextToUpdate;
    prVar7 = ms->ldmSeqStore;
    if (prVar7 == (rawSeqStore_t *)0x0) {
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_78 = 0;
    }
    else {
      local_78 = prVar7->capacity;
      local_98._0_8_ = prVar7->seq;
      local_98._8_8_ = prVar7->pos;
      local_88._0_8_ = prVar7->posInSequence;
      local_88._8_8_ = prVar7->size;
    }
    pZVar8 = (ms->opt).matchTable;
    pZVar59 = (ms->opt).priceTable;
    local_68 = 0;
    local_70._0_4_ = 0;
    local_70._4_4_ = 0;
    local_d8 = (ZSTD_optimal_t *)srcSize;
    ZSTD_opt_getNextMatchAndUpdateSeqStore((ZSTD_optLdm_t *)local_98,0,(U32)srcSize);
    ZSTD_rescaleFreqs(poVar2,(BYTE *)src,srcSize,2);
    puVar40 = (ulong *)((ulong)(pBVar61 + uVar13 == (BYTE *)src) + (long)src);
    if (puVar40 < local_130) {
      puVar18 = (ulong *)((long)local_d8 + (long)src);
      uVar13 = (uint)(uVar26 != 3);
      uVar26 = uVar13 + 3;
      local_100 = (U32 *)(ulong)(uVar13 + 2);
      puVar1 = (ulong *)((long)puVar18 - 7);
      puVar35 = (ulong *)((long)puVar18 - 3);
      local_170 = (ulong *)((long)puVar18 + -1);
      local_b8 = pZVar59->rep;
      puVar19 = puVar18 + -4;
      local_c0 = (ulong)(uVar13 + 5 & 0xfffffffc);
      lVar20 = (ulong)uVar26 - 2;
      auVar65._8_4_ = (int)lVar20;
      auVar65._0_8_ = lVar20;
      auVar65._12_4_ = (int)((ulong)lVar20 >> 0x20);
      local_120 = pZVar59 + 4;
      local_e0 = (ulong *)src;
      local_48 = auVar65 ^ _DAT_0025e440;
LAB_00210db0:
      iVar64 = (int)puVar40;
      local_190 = (ZSTD_optimal_t *)(ulong)(uint)(iVar64 - (int)src);
      pBVar61 = (ms->window).base;
      uVar13 = ms->nextToUpdate;
      uVar21 = (ulong)uVar13;
      uVar37 = 0;
      if (pBVar61 + uVar21 <= puVar40) {
        UVar15 = (ms->cParams).minMatch;
        uVar37 = iVar64 - (int)pBVar61;
        while (uVar13 < uVar37) {
          UVar14 = ZSTD_insertBt1(ms,pBVar61 + uVar21,(BYTE *)puVar18,UVar15,0);
          uVar13 = (int)uVar21 + UVar14;
          uVar21 = (ulong)uVar13;
        }
        ms->nextToUpdate = uVar37;
        local_1a0._4_4_ = (undefined4)((ulong)local_1a0 >> 0x20);
        if (UVar15 - 6 < 2) {
          uVar21 = (ulong)((int)local_190 == 0);
          uVar13 = (ms->cParams).targetLength;
          if (0xffe < uVar13) {
            uVar13 = 0xfff;
          }
          local_1a0 = (ZSTD_optimal_t *)CONCAT44(local_1a0._4_4_,uVar13);
          pBVar61 = (ms->window).base;
          uVar54 = iVar64 - (int)pBVar61;
          uVar51 = 0;
          uVar60 = *puVar40 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar27 = uVar54 - uVar49;
          if (uVar54 < uVar49) {
            uVar27 = 0;
          }
          pUVar62 = ms->chainTable;
          uVar37 = (ms->window).lowLimit;
          uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar55 = uVar54 - uVar38;
          if (uVar54 - uVar37 <= uVar38) {
            uVar55 = uVar37;
          }
          if (ms->loadedDictEnd != 0) {
            uVar55 = uVar37;
          }
          uVar32 = uVar55 + (uVar55 == 0);
          uVar50 = (ulong)((uVar49 & uVar54) * 2);
          local_258 = pUVar62 + uVar50;
          local_1c8 = pUVar62 + uVar50 + 1;
          UVar15 = (ms->window).dictLimit;
          local_198 = ms->hashTable;
          uVar39 = local_198[uVar60];
          iVar28 = uVar54 + 9;
          uVar38 = (ms->cParams).searchLog;
          uVar50 = uVar21 + 3;
          puVar45 = (ulong *)((long)puVar40 + 4);
          pUVar23 = local_100;
          do {
            uVar37 = (int)local_168 - 1;
            if (uVar21 != 3) {
              uVar37 = *(uint *)((long)&local_168 + uVar21 * 4);
            }
            pUVar22 = (U32 *)0x0;
            if (((uVar37 - 1 < uVar54 - UVar15) && (uVar55 <= uVar54 - uVar37)) &&
               ((uint)*puVar40 == *(uint *)((long)puVar40 - (ulong)uVar37))) {
              lVar20 = -(ulong)uVar37;
              puVar33 = (ulong *)((long)puVar45 + lVar20);
              puVar36 = puVar45;
              if (puVar45 < puVar1) {
                if (*puVar33 == *puVar45) {
                  lVar20 = lVar20 + 0xc;
                  lVar58 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar40 + lVar58 + 0xc);
                    if (puVar1 <= puVar36) {
                      puVar33 = (ulong *)((long)puVar40 + lVar58 + lVar20);
                      goto LAB_002113e2;
                    }
                    uVar56 = *(ulong *)((long)puVar40 + lVar58 + lVar20);
                    lVar58 = lVar58 + 8;
                  } while (uVar56 == *puVar36);
                  uVar56 = *puVar36 ^ uVar56;
                  uVar52 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                    }
                  }
                  uVar37 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar58;
                }
                else {
                  uVar52 = *puVar45 ^ *puVar33;
                  uVar56 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                    }
                  }
                  uVar37 = (uint)(uVar56 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_002113e2:
                if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar36 < puVar18) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                }
                uVar37 = (int)puVar36 - (int)puVar45;
              }
              pUVar22 = (U32 *)(ulong)(uVar37 + 4);
            }
            if (pUVar23 < pUVar22) {
              pZVar8[uVar51].off = (int)uVar21 - (uint)((int)local_190 == 0);
              pZVar8[uVar51].len = (uint)pUVar22;
              uVar37 = (int)uVar51 + 1;
              uVar51 = (ulong)uVar37;
              if ((uVar13 < (uint)pUVar22) ||
                 (pUVar23 = pUVar22, (ulong *)((long)puVar40 + (long)pUVar22) == puVar18))
              goto LAB_0021224f;
            }
            uVar37 = (uint)uVar51;
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar50);
          local_198[uVar60] = uVar54;
          if (uVar32 <= uVar39) {
            uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
            pUVar22 = (U32 *)0x0;
            pUVar44 = (U32 *)0x0;
            iVar68 = iVar28;
            do {
              local_1a0 = (ZSTD_optimal_t *)pUVar22;
              uVar21 = (ulong)uVar39;
              pUVar42 = pUVar44;
              if (local_1a0 < pUVar44) {
                pUVar42 = (U32 *)local_1a0;
              }
              puVar45 = (ulong *)((long)puVar40 + (long)pUVar42);
              puVar33 = (ulong *)(pBVar61 + uVar21 + (long)pUVar42);
              puVar36 = puVar45;
              if (puVar45 < puVar1) {
                if (*puVar33 == *puVar45) {
                  lVar20 = 0;
                  do {
                    puVar36 = (ulong *)((long)(puVar40 + 1) + (long)pUVar42 + lVar20);
                    if (puVar1 <= puVar36) {
                      puVar33 = (ulong *)(pBVar61 + (long)pUVar42 + lVar20 + 8 + uVar21);
                      goto LAB_00211587;
                    }
                    lVar58 = lVar20 + uVar21 + 8;
                    lVar20 = lVar20 + 8;
                  } while (*(ulong *)(pBVar61 + (long)pUVar42 + lVar58) == *puVar36);
                  uVar50 = *puVar36 ^ *(ulong *)(pBVar61 + (long)pUVar42 + lVar58);
                  uVar60 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  uVar60 = (uVar60 >> 3 & 0x1fffffff) + lVar20;
                }
                else {
                  uVar50 = *puVar45 ^ *puVar33;
                  uVar60 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  uVar60 = uVar60 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00211587:
                if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar36 < puVar18) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                }
                uVar60 = (long)puVar36 - (long)puVar45;
              }
              pUVar42 = (U32 *)(uVar60 + (long)pUVar42);
              iVar28 = iVar68;
              if (pUVar23 < pUVar42) {
                iVar28 = uVar39 + (U32)pUVar42;
                if (pUVar42 <= (int *)(ulong)(iVar68 - uVar39)) {
                  iVar28 = iVar68;
                }
                pZVar8[uVar51].off = (uVar54 + 2) - uVar39;
                pZVar8[uVar51].len = (U32)pUVar42;
                uVar37 = (int)uVar51 + 1;
                uVar51 = (ulong)uVar37;
                if (((U32 *)0x1000 < pUVar42) ||
                   (pUVar23 = pUVar42, (ulong *)((long)puVar40 + (long)pUVar42) == puVar18)) break;
              }
              uVar37 = (uint)uVar51;
              puVar30 = pUVar62 + (uVar39 & uVar49) * 2;
              if ((pBVar61 + uVar21)[(long)pUVar42] < *(byte *)((long)puVar40 + (long)pUVar42)) {
                *local_258 = uVar39;
                if (uVar39 <= uVar27) goto LAB_002120fe;
                puVar30 = puVar30 + 1;
                pUVar22 = pUVar42;
                pUVar42 = pUVar44;
                local_258 = puVar30;
              }
              else {
                *local_1c8 = uVar39;
                pUVar22 = (U32 *)local_1a0;
                local_1c8 = puVar30;
                if (uVar39 <= uVar27) goto LAB_00212118;
              }
              bVar63 = uVar13 == 0;
              uVar13 = uVar13 - 1;
              if ((bVar63) ||
                 (uVar39 = *puVar30, pUVar44 = pUVar42, iVar68 = iVar28, uVar39 < uVar32)) break;
            } while( true );
          }
          goto LAB_00211998;
        }
        if (UVar15 == 5) {
          uVar21 = (ulong)((int)local_190 == 0);
          uVar13 = (ms->cParams).targetLength;
          if (0xffe < uVar13) {
            uVar13 = 0xfff;
          }
          local_1a0 = (ZSTD_optimal_t *)CONCAT44(local_1a0._4_4_,uVar13);
          pBVar61 = (ms->window).base;
          uVar54 = iVar64 - (int)pBVar61;
          uVar51 = 0;
          uVar60 = *puVar40 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar27 = uVar54 - uVar49;
          if (uVar54 < uVar49) {
            uVar27 = 0;
          }
          pUVar62 = ms->chainTable;
          uVar37 = (ms->window).lowLimit;
          uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar55 = uVar54 - uVar38;
          if (uVar54 - uVar37 <= uVar38) {
            uVar55 = uVar37;
          }
          if (ms->loadedDictEnd != 0) {
            uVar55 = uVar37;
          }
          uVar32 = uVar55 + (uVar55 == 0);
          uVar50 = (ulong)((uVar49 & uVar54) * 2);
          local_258 = pUVar62 + uVar50;
          local_1c8 = pUVar62 + uVar50 + 1;
          UVar15 = (ms->window).dictLimit;
          local_198 = ms->hashTable;
          uVar39 = local_198[uVar60];
          iVar28 = uVar54 + 9;
          uVar38 = (ms->cParams).searchLog;
          uVar50 = uVar21 + 3;
          puVar45 = (ulong *)((long)puVar40 + 4);
          pUVar23 = local_100;
          do {
            uVar37 = (int)local_168 - 1;
            if (uVar21 != 3) {
              uVar37 = *(uint *)((long)&local_168 + uVar21 * 4);
            }
            pUVar22 = (U32 *)0x0;
            if (((uVar37 - 1 < uVar54 - UVar15) && (uVar55 <= uVar54 - uVar37)) &&
               ((uint)*puVar40 == *(uint *)((long)puVar40 - (ulong)uVar37))) {
              lVar20 = -(ulong)uVar37;
              puVar33 = (ulong *)((long)puVar45 + lVar20);
              puVar36 = puVar45;
              if (puVar45 < puVar1) {
                if (*puVar33 == *puVar45) {
                  lVar20 = lVar20 + 0xc;
                  lVar58 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar40 + lVar58 + 0xc);
                    if (puVar1 <= puVar36) {
                      puVar33 = (ulong *)((long)puVar40 + lVar58 + lVar20);
                      goto LAB_002118c6;
                    }
                    uVar56 = *(ulong *)((long)puVar40 + lVar58 + lVar20);
                    lVar58 = lVar58 + 8;
                  } while (uVar56 == *puVar36);
                  uVar56 = *puVar36 ^ uVar56;
                  uVar52 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                    }
                  }
                  uVar37 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar58;
                }
                else {
                  uVar52 = *puVar45 ^ *puVar33;
                  uVar56 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                    }
                  }
                  uVar37 = (uint)(uVar56 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_002118c6:
                if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar36 < puVar18) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                }
                uVar37 = (int)puVar36 - (int)puVar45;
              }
              pUVar22 = (U32 *)(ulong)(uVar37 + 4);
            }
            if (pUVar23 < pUVar22) {
              pZVar8[uVar51].off = (int)uVar21 - (uint)((int)local_190 == 0);
              pZVar8[uVar51].len = (uint)pUVar22;
              uVar37 = (int)uVar51 + 1;
              uVar51 = (ulong)uVar37;
              if ((uVar13 < (uint)pUVar22) ||
                 (pUVar23 = pUVar22, (ulong *)((long)puVar40 + (long)pUVar22) == puVar18))
              goto LAB_0021224f;
            }
            uVar37 = (uint)uVar51;
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar50);
          local_198[uVar60] = uVar54;
          if (uVar32 <= uVar39) {
            uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
            pUVar22 = (U32 *)0x0;
            pUVar44 = (U32 *)0x0;
            iVar68 = iVar28;
            do {
              local_1a0 = (ZSTD_optimal_t *)pUVar22;
              uVar21 = (ulong)uVar39;
              pUVar42 = pUVar44;
              if (local_1a0 < pUVar44) {
                pUVar42 = (U32 *)local_1a0;
              }
              puVar45 = (ulong *)((long)puVar40 + (long)pUVar42);
              puVar33 = (ulong *)(pBVar61 + uVar21 + (long)pUVar42);
              puVar36 = puVar45;
              if (puVar45 < puVar1) {
                if (*puVar33 == *puVar45) {
                  lVar20 = 0;
                  do {
                    puVar36 = (ulong *)((long)(puVar40 + 1) + (long)pUVar42 + lVar20);
                    if (puVar1 <= puVar36) {
                      puVar33 = (ulong *)(pBVar61 + (long)pUVar42 + lVar20 + 8 + uVar21);
                      goto LAB_00211d70;
                    }
                    lVar58 = lVar20 + uVar21 + 8;
                    lVar20 = lVar20 + 8;
                  } while (*(ulong *)(pBVar61 + (long)pUVar42 + lVar58) == *puVar36);
                  uVar50 = *puVar36 ^ *(ulong *)(pBVar61 + (long)pUVar42 + lVar58);
                  uVar60 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  uVar60 = (uVar60 >> 3 & 0x1fffffff) + lVar20;
                }
                else {
                  uVar50 = *puVar45 ^ *puVar33;
                  uVar60 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  uVar60 = uVar60 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00211d70:
                if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar36 < puVar18) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                }
                uVar60 = (long)puVar36 - (long)puVar45;
              }
              pUVar42 = (U32 *)(uVar60 + (long)pUVar42);
              iVar28 = iVar68;
              if (pUVar23 < pUVar42) {
                iVar28 = uVar39 + (U32)pUVar42;
                if (pUVar42 <= (int *)(ulong)(iVar68 - uVar39)) {
                  iVar28 = iVar68;
                }
                pZVar8[uVar51].off = (uVar54 + 2) - uVar39;
                pZVar8[uVar51].len = (U32)pUVar42;
                uVar37 = (int)uVar51 + 1;
                uVar51 = (ulong)uVar37;
                if (((U32 *)0x1000 < pUVar42) ||
                   (pUVar23 = pUVar42, (ulong *)((long)puVar40 + (long)pUVar42) == puVar18)) break;
              }
              uVar37 = (uint)uVar51;
              puVar30 = pUVar62 + (uVar39 & uVar49) * 2;
              if ((pBVar61 + uVar21)[(long)pUVar42] < *(byte *)((long)puVar40 + (long)pUVar42)) {
                *local_258 = uVar39;
                if (uVar39 <= uVar27) goto LAB_002120fe;
                puVar30 = puVar30 + 1;
                pUVar22 = pUVar42;
                pUVar42 = pUVar44;
                local_258 = puVar30;
              }
              else {
                *local_1c8 = uVar39;
                pUVar22 = (U32 *)local_1a0;
                local_1c8 = puVar30;
                if (uVar39 <= uVar27) goto LAB_00212118;
              }
              bVar63 = uVar13 == 0;
              uVar13 = uVar13 - 1;
              if ((bVar63) ||
                 (uVar39 = *puVar30, pUVar44 = pUVar42, iVar68 = iVar28, uVar39 < uVar32)) break;
            } while( true );
          }
          goto LAB_00211998;
        }
        if (UVar15 == 3) {
          uVar21 = (ulong)((int)local_190 == 0);
          uVar13 = (ms->cParams).targetLength;
          if (0xffe < uVar13) {
            uVar13 = 0xfff;
          }
          local_1a0 = (ZSTD_optimal_t *)CONCAT44(local_1a0._4_4_,uVar13);
          pBVar61 = (ms->window).base;
          uVar54 = iVar64 - (int)pBVar61;
          uVar60 = 0;
          uVar51 = (ulong)((uint)*puVar40 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar27 = uVar54 - uVar49;
          if (uVar54 < uVar49) {
            uVar27 = 0;
          }
          pUVar62 = ms->chainTable;
          uVar37 = (ms->window).lowLimit;
          uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar55 = uVar54 - uVar38;
          if (uVar54 - uVar37 <= uVar38) {
            uVar55 = uVar37;
          }
          if (ms->loadedDictEnd != 0) {
            uVar55 = uVar37;
          }
          uVar38 = uVar55 + (uVar55 == 0);
          uVar50 = (ulong)((uVar49 & uVar54) * 2);
          local_200 = pUVar62 + uVar50;
          local_250 = (ulong *)(pUVar62 + uVar50 + 1);
          UVar15 = (ms->window).dictLimit;
          local_178 = (ulong *)ms->hashTable;
          local_198 = (uint *)(ulong)*(uint *)((long)local_178 + uVar51 * 4);
          iVar28 = uVar54 + 9;
          local_138._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
          local_138 = CONCAT44(local_138._4_4_,(ms->cParams).searchLog);
          uVar50 = uVar21 + 3;
          puVar45 = (ulong *)((long)puVar40 + 3);
          pUVar23 = local_100;
          do {
            uVar37 = (int)local_168 - 1;
            if (uVar21 != 3) {
              uVar37 = *(uint *)((long)&local_168 + uVar21 * 4);
            }
            pUVar22 = (U32 *)0x0;
            if (((uVar37 - 1 < uVar54 - UVar15) && (uVar55 <= uVar54 - uVar37)) &&
               (((*(uint *)((long)puVar40 - (ulong)uVar37) ^ (uint)*puVar40) & 0xffffff) == 0)) {
              lVar20 = -(ulong)uVar37;
              puVar33 = (ulong *)((long)puVar45 + lVar20);
              puVar36 = puVar45;
              if (puVar45 < puVar1) {
                if (*puVar33 == *puVar45) {
                  lVar20 = lVar20 + 0xb;
                  lVar58 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar40 + lVar58 + 0xb);
                    if (puVar1 <= puVar36) {
                      puVar33 = (ulong *)((long)puVar40 + lVar58 + lVar20);
                      goto LAB_0021106e;
                    }
                    uVar56 = *(ulong *)((long)puVar40 + lVar58 + lVar20);
                    lVar58 = lVar58 + 8;
                  } while (uVar56 == *puVar36);
                  uVar56 = *puVar36 ^ uVar56;
                  uVar52 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                    }
                  }
                  uVar37 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar58;
                }
                else {
                  uVar52 = *puVar45 ^ *puVar33;
                  uVar56 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                    }
                  }
                  uVar37 = (uint)(uVar56 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0021106e:
                if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar33 = (ulong *)((long)puVar33 + 4);
                }
                if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar33 = (ulong *)((long)puVar33 + 2);
                }
                if (puVar36 < puVar18) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                }
                uVar37 = (int)puVar36 - (int)puVar45;
              }
              pUVar22 = (U32 *)(ulong)(uVar37 + 3);
            }
            if (pUVar23 < pUVar22) {
              pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
              pZVar8[uVar60].len = (uint)pUVar22;
              uVar37 = (int)uVar60 + 1;
              uVar60 = (ulong)uVar37;
              if ((uVar13 < (uint)pUVar22) ||
                 (pUVar23 = pUVar22, (ulong *)((long)puVar40 + (long)pUVar22) == puVar18))
              goto LAB_0021224f;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar50);
          if (((pUVar23 < (U32 *)0x3) &&
              (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_144,(BYTE *)puVar40),
              uVar38 <= UVar15)) && (uVar54 - UVar15 < 0x40000)) {
            uVar21 = (ulong)UVar15;
            puVar33 = (ulong *)(pBVar61 + uVar21);
            puVar45 = puVar40;
            if (puVar40 < puVar1) {
              if (*puVar33 == *puVar40) {
                lVar20 = 0;
                do {
                  puVar45 = (ulong *)((long)puVar40 + lVar20 + 8);
                  if (puVar1 <= puVar45) {
                    puVar33 = (ulong *)(pBVar61 + lVar20 + uVar21 + 8);
                    puVar45 = (ulong *)((long)puVar40 + lVar20 + 8);
                    goto LAB_00212184;
                  }
                  lVar58 = lVar20 + uVar21 + 8;
                  uVar50 = *puVar45;
                  lVar20 = lVar20 + 8;
                } while (*(ulong *)(pBVar61 + lVar58) == uVar50);
                uVar50 = uVar50 ^ *(ulong *)(pBVar61 + lVar58);
                uVar21 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pUVar22 = (U32 *)((uVar21 >> 3 & 0x1fffffff) + lVar20);
              }
              else {
                uVar50 = *puVar40 ^ *puVar33;
                uVar21 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pUVar22 = (U32 *)(uVar21 >> 3 & 0x1fffffff);
              }
            }
            else {
LAB_00212184:
              if ((puVar45 < puVar35) && ((uint)*puVar33 == (uint)*puVar45)) {
                puVar45 = (ulong *)((long)puVar45 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar45 < local_170) && ((short)*puVar33 == (short)*puVar45)) {
                puVar45 = (ulong *)((long)puVar45 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar45 < puVar18) {
                puVar45 = (ulong *)((long)puVar45 + (ulong)((char)*puVar33 == (char)*puVar45));
              }
              pUVar22 = (U32 *)((long)puVar45 - (long)puVar40);
            }
            if (pUVar22 < (U32 *)0x3) goto LAB_00212208;
            pZVar8->off = (uVar54 - UVar15) + 2;
            pZVar8->len = (U32)pUVar22;
            if ((pUVar22 <= (int *)((ulong)local_1a0 & 0xffffffff)) &&
               (uVar60 = 1, pUVar23 = pUVar22, (ulong *)((long)puVar40 + (long)pUVar22) != puVar18))
            goto LAB_00212208;
            UVar15 = uVar54 + 1;
            uVar37 = 1;
          }
          else {
LAB_00212208:
            uVar37 = (uint)uVar60;
            *(uint *)((long)local_178 + uVar51 * 4) = uVar54;
            if (uVar38 <= (uint)local_198) {
              uVar13 = ~(-1 << ((byte)local_138 & 0x1f));
              pUVar22 = (U32 *)0x0;
              pUVar44 = (U32 *)0x0;
              puVar30 = local_198;
              do {
                local_1a0 = (ZSTD_optimal_t *)pUVar44;
                pUVar44 = pUVar22;
                if (local_1a0 < pUVar22) {
                  pUVar44 = (U32 *)local_1a0;
                }
                uVar55 = (uint)puVar30;
                uVar21 = (ulong)puVar30 & 0xffffffff;
                puVar45 = (ulong *)((long)puVar40 + (long)pUVar44);
                puVar33 = (ulong *)(pBVar61 + uVar21 + (long)pUVar44);
                puVar36 = puVar45;
                if (puVar45 < puVar1) {
                  if (*puVar33 == *puVar45) {
                    lVar20 = 0;
                    do {
                      puVar36 = (ulong *)((long)(puVar40 + 1) + (long)pUVar44 + lVar20);
                      if (puVar1 <= puVar36) {
                        puVar33 = (ulong *)(pBVar61 + (long)pUVar44 + lVar20 + 8 + uVar21);
                        goto LAB_00214846;
                      }
                      lVar58 = lVar20 + uVar21 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(pBVar61 + (long)pUVar44 + lVar58) == *puVar36);
                    uVar50 = *puVar36 ^ *(ulong *)(pBVar61 + (long)pUVar44 + lVar58);
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar50 = *puVar45 ^ *puVar33;
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = uVar51 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00214846:
                  if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar36 < puVar18) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                  }
                  uVar51 = (long)puVar36 - (long)puVar45;
                }
                pUVar44 = (U32 *)(uVar51 + (long)pUVar44);
                if (pUVar23 < pUVar44) {
                  iVar68 = (U32)pUVar44 + uVar55;
                  if (pUVar44 <= (int *)(ulong)(iVar28 - uVar55)) {
                    iVar68 = iVar28;
                  }
                  iVar28 = iVar68;
                  pZVar8[uVar60].off = (uVar54 + 2) - uVar55;
                  pZVar8[uVar60].len = (U32)pUVar44;
                  uVar37 = (int)uVar60 + 1;
                  uVar60 = (ulong)uVar37;
                  if (((U32 *)0x1000 < pUVar44) ||
                     (pUVar23 = pUVar44, (ulong *)((long)puVar40 + (long)pUVar44) == puVar18))
                  break;
                }
                uVar37 = (uint)uVar60;
                puVar31 = pUVar62 + (uVar55 & uVar49) * 2;
                if ((pBVar61 + uVar21)[(long)pUVar44] < *(byte *)((long)puVar40 + (long)pUVar44)) {
                  *local_200 = uVar55;
                  if (uVar55 <= uVar27) {
                    local_200 = &local_1a4;
                    break;
                  }
                  puVar31 = puVar31 + 1;
                  local_200 = puVar31;
                }
                else {
                  *(uint *)local_250 = uVar55;
                  pUVar22 = pUVar44;
                  pUVar44 = (U32 *)local_1a0;
                  local_250 = (ulong *)puVar31;
                  if (uVar55 <= uVar27) {
                    local_250 = (ulong *)&local_1a4;
                    break;
                  }
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if ((bVar63) || (puVar30 = (uint *)(ulong)*puVar31, *puVar31 < uVar38)) break;
              } while( true );
            }
            *(uint *)local_250 = 0;
            *local_200 = 0;
            UVar15 = iVar28 - 8;
          }
          ms->nextToUpdate = UVar15;
          goto LAB_0021224f;
        }
        uVar21 = (ulong)((int)local_190 == 0);
        uVar13 = (ms->cParams).targetLength;
        if (0xffe < uVar13) {
          uVar13 = 0xfff;
        }
        local_1a0 = (ZSTD_optimal_t *)CONCAT44(local_1a0._4_4_,uVar13);
        pBVar61 = (ms->window).base;
        uVar49 = iVar64 - (int)pBVar61;
        uVar60 = 0;
        uVar55 = (uint)*puVar40 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
        uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar27 = uVar49 - uVar54;
        if (uVar49 < uVar54) {
          uVar27 = 0;
        }
        pUVar62 = ms->chainTable;
        uVar37 = (ms->window).lowLimit;
        uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar38 = uVar49 - uVar39;
        if (uVar49 - uVar37 <= uVar39) {
          uVar38 = uVar37;
        }
        if (ms->loadedDictEnd != 0) {
          uVar38 = uVar37;
        }
        uVar53 = uVar38 + (uVar38 == 0);
        uVar51 = (ulong)((uVar54 & uVar49) * 2);
        local_250 = (ulong *)(pUVar62 + uVar51);
        local_1c8 = pUVar62 + uVar51 + 1;
        UVar15 = (ms->window).dictLimit;
        local_198 = ms->hashTable;
        uVar32 = local_198[uVar55];
        iVar28 = uVar49 + 9;
        uVar39 = (ms->cParams).searchLog;
        uVar51 = uVar21 + 3;
        puVar45 = (ulong *)((long)puVar40 + 4);
        pUVar23 = local_100;
        do {
          uVar37 = (int)local_168 - 1;
          if (uVar21 != 3) {
            uVar37 = *(uint *)((long)&local_168 + uVar21 * 4);
          }
          uVar16 = 0;
          if (((uVar37 - 1 < uVar49 - UVar15) && (uVar38 <= uVar49 - uVar37)) &&
             (uVar16 = 0, (uint)*puVar40 == *(uint *)((long)puVar40 - (ulong)uVar37))) {
            lVar20 = -(ulong)uVar37;
            puVar33 = (ulong *)((long)puVar45 + lVar20);
            puVar36 = puVar45;
            if (puVar45 < puVar1) {
              if (*puVar33 == *puVar45) {
                lVar20 = lVar20 + 0xc;
                lVar58 = 0;
                do {
                  puVar36 = (ulong *)((long)puVar40 + lVar58 + 0xc);
                  if (puVar1 <= puVar36) {
                    puVar33 = (ulong *)((long)puVar40 + lVar58 + lVar20);
                    goto LAB_00211b91;
                  }
                  uVar50 = *(ulong *)((long)puVar40 + lVar58 + lVar20);
                  lVar58 = lVar58 + 8;
                } while (uVar50 == *puVar36);
                uVar50 = *puVar36 ^ uVar50;
                uVar56 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                  }
                }
                uVar16 = ((uint)(uVar56 >> 3) & 0x1fffffff) + (int)lVar58;
              }
              else {
                uVar56 = *puVar45 ^ *puVar33;
                uVar50 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                uVar16 = (uint)(uVar50 >> 3) & 0x1fffffff;
              }
            }
            else {
LAB_00211b91:
              if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar36 < puVar18) {
                puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
              }
              uVar16 = (int)puVar36 - (int)puVar45;
            }
            uVar16 = uVar16 + 4;
          }
          pUVar22 = (U32 *)(ulong)uVar16;
          if (pUVar23 < pUVar22) {
            pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
            pZVar8[uVar60].len = uVar16;
            uVar37 = (int)uVar60 + 1;
            uVar60 = (ulong)uVar37;
            if ((uVar13 < uVar16) ||
               (pUVar23 = pUVar22, (ulong *)((long)puVar40 + (long)pUVar22) == puVar18))
            goto LAB_0021224f;
          }
          uVar37 = (uint)uVar60;
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar51);
        local_198[uVar55] = uVar49;
        if (uVar53 <= uVar32) {
          uVar13 = ~(-1 << ((byte)uVar39 & 0x1f));
          pUVar22 = (U32 *)0x0;
          pUVar44 = (U32 *)0x0;
          do {
            local_1a0 = (ZSTD_optimal_t *)pUVar22;
            uVar21 = (ulong)uVar32;
            pUVar42 = pUVar44;
            if (local_1a0 < pUVar44) {
              pUVar42 = (U32 *)local_1a0;
            }
            puVar45 = (ulong *)((long)puVar40 + (long)pUVar42);
            puVar33 = (ulong *)(pBVar61 + uVar21 + (long)pUVar42);
            puVar36 = puVar45;
            if (puVar45 < puVar1) {
              if (*puVar33 == *puVar45) {
                lVar20 = 0;
                do {
                  puVar36 = (ulong *)((long)(puVar40 + 1) + (long)pUVar42 + lVar20);
                  if (puVar1 <= puVar36) {
                    puVar33 = (ulong *)(pBVar61 + (long)pUVar42 + lVar20 + 8 + uVar21);
                    goto LAB_00211fc0;
                  }
                  lVar58 = lVar20 + uVar21 + 8;
                  lVar20 = lVar20 + 8;
                } while (*(ulong *)(pBVar61 + (long)pUVar42 + lVar58) == *puVar36);
                uVar50 = *puVar36 ^ *(ulong *)(pBVar61 + (long)pUVar42 + lVar58);
                uVar51 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
              }
              else {
                uVar50 = *puVar45 ^ *puVar33;
                uVar51 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar51 = uVar51 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00211fc0:
              if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar36 < puVar18) {
                puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
              }
              uVar51 = (long)puVar36 - (long)puVar45;
            }
            pUVar42 = (U32 *)(uVar51 + (long)pUVar42);
            if (pUVar23 < pUVar42) {
              iVar68 = uVar32 + (U32)pUVar42;
              if (pUVar42 <= (int *)(ulong)(iVar28 - uVar32)) {
                iVar68 = iVar28;
              }
              iVar28 = iVar68;
              pZVar8[uVar60].off = (uVar49 + 2) - uVar32;
              pZVar8[uVar60].len = (U32)pUVar42;
              uVar37 = (int)uVar60 + 1;
              uVar60 = (ulong)uVar37;
              if (((U32 *)0x1000 < pUVar42) ||
                 (pUVar23 = pUVar42, (ulong *)((long)puVar40 + (long)pUVar42) == puVar18)) break;
            }
            uVar37 = (uint)uVar60;
            puVar30 = pUVar62 + (uVar32 & uVar54) * 2;
            if ((pBVar61 + uVar21)[(long)pUVar42] < *(byte *)((long)puVar40 + (long)pUVar42)) {
              *(uint *)local_250 = uVar32;
              if (uVar32 <= uVar27) {
                local_250 = (ulong *)&local_1a4;
                break;
              }
              puVar30 = puVar30 + 1;
              pUVar22 = pUVar42;
              pUVar42 = pUVar44;
              local_250 = (ulong *)puVar30;
            }
            else {
              *local_1c8 = uVar32;
              pUVar22 = (U32 *)local_1a0;
              local_1c8 = puVar30;
              if (uVar32 <= uVar27) {
                local_1c8 = &local_1a4;
                break;
              }
            }
            bVar63 = uVar13 == 0;
            uVar13 = uVar13 - 1;
            if ((bVar63) || (uVar32 = *puVar30, pUVar44 = pUVar42, uVar32 < uVar53)) break;
          } while( true );
        }
        *local_1c8 = 0;
        goto LAB_00211c68;
      }
      goto LAB_0021224f;
    }
LAB_002149b7:
    ZSTD_resetSeqStore(local_e8);
    pBVar61 = (ms->window).base + -(long)local_d8;
    (ms->window).base = pBVar61;
    UVar15 = (ms->window).dictLimit + (int)local_d8;
    (ms->window).dictLimit = UVar15;
    (ms->window).lowLimit = UVar15;
    ms->nextToUpdate = UVar15;
    if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
      puVar30 = poVar2->litFreq;
      iVar64 = 0;
      iVar28 = 0;
      iVar68 = 0;
      iVar69 = 0;
      lVar20 = 0;
      do {
        puVar31 = puVar30 + lVar20;
        uVar26 = *puVar31 * 0x10 - 1;
        uVar13 = puVar31[1] * 0x10 - 1;
        uVar37 = puVar31[2] * 0x10 - 1;
        uVar27 = puVar31[3] * 0x10 - 1;
        puVar31 = puVar30 + lVar20;
        *puVar31 = uVar26;
        puVar31[1] = uVar13;
        puVar31[2] = uVar37;
        puVar31[3] = uVar27;
        iVar64 = iVar64 + uVar26;
        iVar28 = iVar28 + uVar13;
        iVar68 = iVar68 + uVar37;
        iVar69 = iVar69 + uVar27;
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x100);
      (ms->opt).litSum = iVar69 + iVar28 + iVar68 + iVar64;
    }
    puVar30 = (ms->opt).litLengthFreq;
    iVar64 = 0;
    iVar28 = 0;
    iVar68 = 0;
    iVar69 = 0;
    lVar20 = 0;
    do {
      puVar31 = puVar30 + lVar20;
      uVar26 = *puVar31 * 0x10 - 1;
      uVar13 = puVar31[1] * 0x10 - 1;
      uVar37 = puVar31[2] * 0x10 - 1;
      uVar27 = puVar31[3] * 0x10 - 1;
      puVar31 = puVar30 + lVar20;
      *puVar31 = uVar26;
      puVar31[1] = uVar13;
      puVar31[2] = uVar37;
      puVar31[3] = uVar27;
      iVar64 = iVar64 + uVar26;
      iVar28 = iVar28 + uVar13;
      iVar68 = iVar68 + uVar37;
      iVar69 = iVar69 + uVar27;
      lVar20 = lVar20 + 4;
    } while (lVar20 != 0x24);
    (ms->opt).litLengthSum = iVar69 + iVar28 + iVar68 + iVar64;
    puVar30 = (ms->opt).matchLengthFreq;
    lVar20 = 0;
    UVar15 = 0;
    do {
      iVar64 = puVar30[lVar20] * 0x10;
      puVar30[lVar20] = iVar64 - 1;
      UVar15 = (UVar15 + iVar64) - 1;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x35);
    (ms->opt).matchLengthSum = UVar15;
    puVar30 = (ms->opt).offCodeFreq;
    iVar64 = 0;
    iVar28 = 0;
    iVar68 = 0;
    iVar69 = 0;
    lVar20 = 0;
    do {
      puVar31 = puVar30 + lVar20;
      uVar26 = *puVar31 * 0x10 - 1;
      uVar13 = puVar31[1] * 0x10 - 1;
      uVar37 = puVar31[2] * 0x10 - 1;
      uVar27 = puVar31[3] * 0x10 - 1;
      puVar31 = puVar30 + lVar20;
      *puVar31 = uVar26;
      puVar31[1] = uVar13;
      puVar31[2] = uVar37;
      puVar31[3] = uVar27;
      iVar64 = iVar64 + uVar26;
      iVar28 = iVar28 + uVar13;
      iVar68 = iVar68 + uVar37;
      iVar69 = iVar69 + uVar27;
      lVar20 = lVar20 + 4;
    } while (lVar20 != 0x20);
    (ms->opt).offCodeSum = iVar69 + iVar28 + iVar68 + iVar64;
    srcSize = (size_t)local_d8;
  }
  poVar2 = &ms->opt;
  puVar40 = (ulong *)((long)puVar45 + (srcSize - 8));
  uVar26 = (ms->window).dictLimit;
  uVar13 = (ms->cParams).targetLength;
  uVar37 = 0xfff;
  if (uVar13 < 0xfff) {
    uVar37 = uVar13;
  }
  local_f0 = CONCAT44(local_f0._4_4_,uVar37);
  uVar13 = (ms->cParams).minMatch;
  local_1a4 = ms->nextToUpdate;
  prVar7 = ms->ldmSeqStore;
  if (prVar7 == (rawSeqStore_t *)0x0) {
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_78 = 0;
  }
  else {
    local_78 = prVar7->capacity;
    local_98._0_8_ = prVar7->seq;
    local_98._8_8_ = prVar7->pos;
    local_88._0_8_ = prVar7->posInSequence;
    local_88._8_8_ = prVar7->size;
  }
  puVar1 = (ulong *)((long)puVar45 + srcSize);
  pZVar8 = (ms->opt).matchTable;
  pZVar59 = (ms->opt).priceTable;
  local_68 = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore((ZSTD_optLdm_t *)local_98,0,(U32)srcSize);
  ZSTD_rescaleFreqs(poVar2,(BYTE *)puVar45,srcSize,2);
  auVar65 = local_48;
  puVar35 = (ulong *)((ulong)((ulong *)(pBVar61 + uVar26) == puVar45) + (long)puVar45);
  local_130 = puVar45;
  if (puVar40 <= puVar35) {
LAB_002187a9:
    return (long)puVar1 - (long)local_130;
  }
  uVar13 = (uint)(uVar13 != 3);
  uVar26 = uVar13 + 3;
  local_108 = (uint *)(ulong)(uVar13 + 2);
  puVar18 = (ulong *)((long)puVar1 - 7);
  puVar19 = (ulong *)((long)puVar1 - 3);
  puVar33 = (ulong *)((long)puVar1 - 1);
  local_170 = puVar1 + -4;
  local_48._4_4_ = 0;
  local_48._0_4_ = uVar13 + 5 & 0xfffffffc;
  lVar20 = (ulong)uVar26 - 2;
  auVar72._8_4_ = (int)lVar20;
  auVar72._0_8_ = lVar20;
  auVar72._12_4_ = (int)((ulong)lVar20 >> 0x20);
  local_d8 = pZVar59 + 4;
  local_1a0 = pZVar59 + 1;
  local_58 = auVar72 ^ _DAT_0025e440;
  local_48._8_8_ = auVar65._8_8_;
  local_120 = pZVar59;
  local_e0 = puVar45;
LAB_00214cd4:
  iVar64 = (int)puVar35;
  local_190 = (ZSTD_optimal_t *)(ulong)(uint)(iVar64 - (int)local_130);
  pBVar61 = (ms->window).base;
  uVar13 = ms->nextToUpdate;
  uVar21 = (ulong)uVar13;
  uVar37 = 0;
  if (pBVar61 + uVar21 <= puVar35) {
    UVar15 = (ms->cParams).minMatch;
    uVar37 = iVar64 - (int)pBVar61;
    pZVar59 = local_120;
    while (local_120 = pZVar59, uVar13 < uVar37) {
      UVar14 = ZSTD_insertBt1(ms,pBVar61 + uVar21,(BYTE *)puVar1,UVar15,0);
      uVar13 = (int)uVar21 + UVar14;
      uVar21 = (ulong)uVar13;
      pZVar59 = local_120;
    }
    ms->nextToUpdate = uVar37;
    local_198._4_4_ = (undefined4)((ulong)local_198 >> 0x20);
    if (UVar15 - 6 < 2) {
      uVar21 = (ulong)(uint)((int)local_190 == 0);
      uVar13 = (ms->cParams).targetLength;
      if (0xffe < uVar13) {
        uVar13 = 0xfff;
      }
      pBVar61 = (ms->window).base;
      uVar49 = iVar64 - (int)pBVar61;
      uVar60 = 0;
      uVar51 = *puVar35 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar27 = uVar49 - uVar54;
      if (uVar49 < uVar54) {
        uVar27 = 0;
      }
      UVar15 = (ms->window).lowLimit;
      uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar14 = uVar49 - uVar37;
      if (uVar49 - UVar15 <= uVar37) {
        UVar14 = UVar15;
      }
      pUVar62 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar15;
      }
      uVar39 = UVar14 + (UVar14 == 0);
      uVar50 = (ulong)((uVar54 & uVar49) * 2);
      local_250 = (ulong *)(pUVar62 + uVar50);
      local_260 = (ulong *)(pUVar62 + uVar50 + 1);
      UVar15 = (ms->window).dictLimit;
      pUVar23 = ms->hashTable;
      uVar38 = pUVar23[uVar51];
      iVar28 = uVar49 + 9;
      uVar55 = (ms->cParams).searchLog;
      local_198 = (uint *)CONCAT44(local_198._4_4_,uVar55);
      uVar50 = uVar21 + 3;
      puVar45 = (ulong *)((long)puVar35 + 4);
      uVar56 = (ulong)local_108;
      do {
        if (uVar21 == 3) {
          UVar17 = (U32)*local_128 - 1;
        }
        else {
          UVar17 = *(U32 *)((long)local_128 + uVar21 * 4);
        }
        uVar52 = 0;
        if (((UVar17 - 1 < uVar49 - UVar15) && (UVar14 <= uVar49 - UVar17)) &&
           ((uint)*puVar35 == *(uint *)((long)puVar35 - (ulong)UVar17))) {
          lVar20 = -(ulong)UVar17;
          puVar36 = (ulong *)((long)puVar45 + lVar20);
          puVar25 = puVar45;
          if (puVar45 < puVar18) {
            if (*puVar36 == *puVar45) {
              lVar20 = lVar20 + 0xc;
              lVar58 = 0;
              do {
                puVar25 = (ulong *)((long)puVar35 + lVar58 + 0xc);
                if (puVar18 <= puVar25) {
                  puVar36 = (ulong *)((long)puVar35 + lVar58 + lVar20);
                  goto LAB_002152c9;
                }
                uVar52 = *(ulong *)((long)puVar35 + lVar58 + lVar20);
                lVar58 = lVar58 + 8;
              } while (uVar52 == *puVar25);
              uVar52 = *puVar25 ^ uVar52;
              uVar47 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar37 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar58;
            }
            else {
              uVar47 = *puVar45 ^ *puVar36;
              uVar52 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                }
              }
              uVar37 = (uint)(uVar52 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_002152c9:
            if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar25 < puVar1) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
            }
            uVar37 = (int)puVar25 - (int)puVar45;
          }
          uVar52 = (ulong)(uVar37 + 4);
        }
        if (uVar56 < uVar52) {
          pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
          pZVar8[uVar60].len = (uint)uVar52;
          uVar37 = (int)uVar60 + 1;
          uVar60 = (ulong)uVar37;
          if ((uVar13 < (uint)uVar52) ||
             (uVar56 = uVar52, (ulong *)((long)puVar35 + uVar52) == puVar1)) goto LAB_00216106;
        }
        uVar37 = (uint)uVar60;
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar50);
      pUVar23[uVar51] = uVar49;
      if (uVar39 <= uVar38) {
        uVar13 = ~(-1 << ((byte)uVar55 & 0x1f));
        uVar21 = 0;
        uVar51 = 0;
        iVar68 = iVar28;
        do {
          uVar52 = (ulong)uVar38;
          uVar50 = uVar51;
          if (uVar21 < uVar51) {
            uVar50 = uVar21;
          }
          puVar45 = (ulong *)((long)puVar35 + uVar50);
          puVar36 = (ulong *)(pBVar61 + uVar50 + uVar52);
          puVar25 = puVar45;
          if (puVar45 < puVar18) {
            if (*puVar36 == *puVar45) {
              lVar20 = 0;
              do {
                puVar25 = (ulong *)((long)puVar35 + lVar20 + uVar50 + 8);
                if (puVar18 <= puVar25) {
                  puVar36 = (ulong *)(pBVar61 + uVar52 + uVar50 + lVar20 + 8);
                  goto LAB_00215485;
                }
                lVar58 = lVar20 + uVar52 + uVar50 + 8;
                lVar20 = lVar20 + 8;
              } while (*(ulong *)(pBVar61 + lVar58) == *puVar25);
              uVar46 = *puVar25 ^ *(ulong *)(pBVar61 + lVar58);
              uVar47 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar20;
            }
            else {
              uVar46 = *puVar45 ^ *puVar36;
              uVar47 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar47 = uVar47 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00215485:
            if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar25 < puVar1) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
            }
            uVar47 = (long)puVar25 - (long)puVar45;
          }
          uVar47 = uVar47 + uVar50;
          iVar28 = iVar68;
          if (uVar56 < uVar47) {
            iVar28 = uVar38 + (U32)uVar47;
            if (uVar47 <= iVar68 - uVar38) {
              iVar28 = iVar68;
            }
            pZVar8[uVar60].off = (uVar49 + 2) - uVar38;
            pZVar8[uVar60].len = (U32)uVar47;
            uVar37 = (int)uVar60 + 1;
            uVar60 = (ulong)uVar37;
            if ((0x1000 < uVar47) || (uVar56 = uVar47, (ulong *)((long)puVar35 + uVar47) == puVar1))
            break;
          }
          uVar37 = (uint)uVar60;
          puVar45 = (ulong *)(pUVar62 + (uVar38 & uVar54) * 2);
          if (pBVar61[uVar47 + uVar52] < *(byte *)((long)puVar35 + uVar47)) {
            *(uint *)local_250 = uVar38;
            if (uVar38 <= uVar27) goto LAB_00215fcc;
            puVar45 = (ulong *)((long)puVar45 + 4);
            uVar21 = uVar47;
            uVar47 = uVar51;
            local_250 = puVar45;
          }
          else {
            *(uint *)local_260 = uVar38;
            local_260 = puVar45;
            if (uVar38 <= uVar27) goto LAB_00215fbf;
          }
          bVar63 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          if ((bVar63) ||
             (uVar38 = (uint)*puVar45, uVar51 = uVar47, iVar68 = iVar28, uVar38 < uVar39)) break;
        } while( true );
      }
      goto LAB_00215881;
    }
    if (UVar15 == 5) {
      uVar21 = (ulong)((int)local_190 == 0);
      uVar13 = (ms->cParams).targetLength;
      if (0xffe < uVar13) {
        uVar13 = 0xfff;
      }
      pBVar61 = (ms->window).base;
      uVar49 = iVar64 - (int)pBVar61;
      uVar60 = 0;
      uVar51 = *puVar35 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar27 = uVar49 - uVar54;
      if (uVar49 < uVar54) {
        uVar27 = 0;
      }
      UVar15 = (ms->window).lowLimit;
      uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar14 = uVar49 - uVar37;
      if (uVar49 - UVar15 <= uVar37) {
        UVar14 = UVar15;
      }
      pUVar62 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar15;
      }
      uVar39 = UVar14 + (UVar14 == 0);
      uVar50 = (ulong)((uVar54 & uVar49) * 2);
      local_250 = (ulong *)(pUVar62 + uVar50);
      local_260 = (ulong *)(pUVar62 + uVar50 + 1);
      UVar15 = (ms->window).dictLimit;
      pUVar23 = ms->hashTable;
      uVar38 = pUVar23[uVar51];
      iVar28 = uVar49 + 9;
      uVar55 = (ms->cParams).searchLog;
      local_198 = (uint *)CONCAT44(local_198._4_4_,uVar55);
      uVar50 = uVar21 + 3;
      puVar45 = (ulong *)((long)puVar35 + 4);
      uVar56 = (ulong)local_108;
      do {
        if (uVar21 == 3) {
          UVar17 = (U32)*local_128 - 1;
        }
        else {
          UVar17 = *(U32 *)((long)local_128 + uVar21 * 4);
        }
        uVar52 = 0;
        if (((UVar17 - 1 < uVar49 - UVar15) && (UVar14 <= uVar49 - UVar17)) &&
           ((uint)*puVar35 == *(uint *)((long)puVar35 - (ulong)UVar17))) {
          lVar20 = -(ulong)UVar17;
          puVar36 = (ulong *)((long)puVar45 + lVar20);
          puVar25 = puVar45;
          if (puVar45 < puVar18) {
            if (*puVar36 == *puVar45) {
              lVar20 = lVar20 + 0xc;
              lVar58 = 0;
              do {
                puVar25 = (ulong *)((long)puVar35 + lVar58 + 0xc);
                if (puVar18 <= puVar25) {
                  puVar36 = (ulong *)((long)puVar35 + lVar58 + lVar20);
                  goto LAB_002157b0;
                }
                uVar52 = *(ulong *)((long)puVar35 + lVar58 + lVar20);
                lVar58 = lVar58 + 8;
              } while (uVar52 == *puVar25);
              uVar52 = *puVar25 ^ uVar52;
              uVar47 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar37 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar58;
            }
            else {
              uVar47 = *puVar45 ^ *puVar36;
              uVar52 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                }
              }
              uVar37 = (uint)(uVar52 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_002157b0:
            if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar25 < puVar1) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
            }
            uVar37 = (int)puVar25 - (int)puVar45;
          }
          uVar52 = (ulong)(uVar37 + 4);
        }
        if (uVar56 < uVar52) {
          pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
          pZVar8[uVar60].len = (uint)uVar52;
          uVar37 = (int)uVar60 + 1;
          uVar60 = (ulong)uVar37;
          if ((uVar13 < (uint)uVar52) ||
             (uVar56 = uVar52, (ulong *)((long)puVar35 + uVar52) == puVar1)) goto LAB_00216106;
        }
        uVar37 = (uint)uVar60;
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar50);
      pUVar23[uVar51] = uVar49;
      if (uVar39 <= uVar38) {
        uVar13 = ~(-1 << ((byte)uVar55 & 0x1f));
        uVar21 = 0;
        uVar51 = 0;
        iVar68 = iVar28;
        do {
          uVar52 = (ulong)uVar38;
          uVar50 = uVar51;
          if (uVar21 < uVar51) {
            uVar50 = uVar21;
          }
          puVar45 = (ulong *)((long)puVar35 + uVar50);
          puVar36 = (ulong *)(pBVar61 + uVar50 + uVar52);
          puVar25 = puVar45;
          if (puVar45 < puVar18) {
            if (*puVar36 == *puVar45) {
              lVar20 = 0;
              do {
                puVar25 = (ulong *)((long)puVar35 + lVar20 + uVar50 + 8);
                if (puVar18 <= puVar25) {
                  puVar36 = (ulong *)(pBVar61 + uVar52 + uVar50 + lVar20 + 8);
                  goto LAB_00215c64;
                }
                lVar58 = lVar20 + uVar52 + uVar50 + 8;
                lVar20 = lVar20 + 8;
              } while (*(ulong *)(pBVar61 + lVar58) == *puVar25);
              uVar46 = *puVar25 ^ *(ulong *)(pBVar61 + lVar58);
              uVar47 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar20;
            }
            else {
              uVar46 = *puVar45 ^ *puVar36;
              uVar47 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar47 = uVar47 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00215c64:
            if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar25 < puVar1) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
            }
            uVar47 = (long)puVar25 - (long)puVar45;
          }
          uVar47 = uVar47 + uVar50;
          iVar28 = iVar68;
          if (uVar56 < uVar47) {
            iVar28 = uVar38 + (U32)uVar47;
            if (uVar47 <= iVar68 - uVar38) {
              iVar28 = iVar68;
            }
            pZVar8[uVar60].off = (uVar49 + 2) - uVar38;
            pZVar8[uVar60].len = (U32)uVar47;
            uVar37 = (int)uVar60 + 1;
            uVar60 = (ulong)uVar37;
            if ((0x1000 < uVar47) || (uVar56 = uVar47, (ulong *)((long)puVar35 + uVar47) == puVar1))
            break;
          }
          uVar37 = (uint)uVar60;
          puVar45 = (ulong *)(pUVar62 + (uVar38 & uVar54) * 2);
          if (pBVar61[uVar47 + uVar52] < *(byte *)((long)puVar35 + uVar47)) {
            *(uint *)local_250 = uVar38;
            if (uVar38 <= uVar27) goto LAB_00215fcc;
            puVar45 = (ulong *)((long)puVar45 + 4);
            uVar21 = uVar47;
            uVar47 = uVar51;
            local_250 = puVar45;
          }
          else {
            *(uint *)local_260 = uVar38;
            local_260 = puVar45;
            if (uVar38 <= uVar27) goto LAB_00215fbf;
          }
          bVar63 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          if ((bVar63) ||
             (uVar38 = (uint)*puVar45, uVar51 = uVar47, iVar68 = iVar28, uVar38 < uVar39)) break;
        } while( true );
      }
      goto LAB_00215881;
    }
    if (UVar15 == 3) {
      uVar21 = (ulong)((int)local_190 == 0);
      uVar13 = (ms->cParams).targetLength;
      if (0xffe < uVar13) {
        uVar13 = 0xfff;
      }
      pBVar61 = (ms->window).base;
      uVar49 = iVar64 - (int)pBVar61;
      uVar60 = 0;
      uVar55 = (uint)*puVar35 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
      uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar27 = uVar49 - uVar54;
      if (uVar49 < uVar54) {
        uVar27 = 0;
      }
      uVar37 = (ms->window).lowLimit;
      uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar38 = uVar49 - uVar39;
      if (uVar49 - uVar37 <= uVar39) {
        uVar38 = uVar37;
      }
      pUVar62 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        uVar38 = uVar37;
      }
      uVar32 = uVar38 + (uVar38 == 0);
      uVar51 = (ulong)((uVar54 & uVar49) * 2);
      local_250 = (ulong *)(pUVar62 + uVar51);
      local_260 = (ulong *)(pUVar62 + uVar51 + 1);
      UVar15 = (ms->window).dictLimit;
      pUVar23 = ms->hashTable;
      uVar39 = pUVar23[uVar55];
      iVar28 = uVar49 + 9;
      local_198 = (uint *)CONCAT44(local_198._4_4_,(ms->cParams).searchLog);
      uVar51 = uVar21 + 3;
      puVar45 = (ulong *)((long)puVar35 + 3);
      uVar50 = (ulong)local_108;
      do {
        if (uVar21 == 3) {
          UVar14 = (U32)*local_128 - 1;
        }
        else {
          UVar14 = *(U32 *)((long)local_128 + uVar21 * 4);
        }
        uVar53 = 0;
        if (((UVar14 - 1 < uVar49 - UVar15) && (uVar53 = 0, uVar38 <= uVar49 - UVar14)) &&
           (((*(uint *)((long)puVar35 - (ulong)UVar14) ^ (uint)*puVar35) & 0xffffff) == 0)) {
          lVar20 = -(ulong)UVar14;
          puVar36 = (ulong *)((long)puVar45 + lVar20);
          puVar25 = puVar45;
          if (puVar45 < puVar18) {
            if (*puVar36 == *puVar45) {
              lVar20 = lVar20 + 0xb;
              lVar58 = 0;
              do {
                puVar25 = (ulong *)((long)puVar35 + lVar58 + 0xb);
                if (puVar18 <= puVar25) {
                  puVar36 = (ulong *)((long)puVar35 + lVar58 + lVar20);
                  goto LAB_00214f70;
                }
                uVar56 = *(ulong *)((long)puVar35 + lVar58 + lVar20);
                lVar58 = lVar58 + 8;
              } while (uVar56 == *puVar25);
              uVar56 = *puVar25 ^ uVar56;
              uVar52 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                }
              }
              uVar53 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar58;
            }
            else {
              uVar52 = *puVar45 ^ *puVar36;
              uVar56 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                }
              }
              uVar53 = (uint)(uVar56 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_00214f70:
            if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar25 < puVar1) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
            }
            uVar53 = (int)puVar25 - (int)puVar45;
          }
          uVar53 = uVar53 + 3;
        }
        uVar56 = (ulong)uVar53;
        if (uVar50 < uVar56) {
          pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
          pZVar8[uVar60].len = uVar53;
          uVar37 = (int)uVar60 + 1;
          uVar60 = (ulong)uVar37;
          if ((uVar13 < uVar53) || (uVar50 = uVar56, (ulong *)((long)puVar35 + uVar56) == puVar1))
          goto LAB_00216106;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar51);
      if (((uVar50 < 3) &&
          (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_1a4,(BYTE *)puVar35),
          uVar32 <= UVar15)) && (uVar49 - UVar15 < 0x40000)) {
        uVar21 = (ulong)UVar15;
        puVar36 = (ulong *)(pBVar61 + uVar21);
        puVar45 = puVar35;
        if (puVar35 < puVar18) {
          if (*puVar36 == *puVar35) {
            lVar20 = 0;
            do {
              puVar45 = (ulong *)((long)puVar35 + lVar20 + 8);
              if (puVar18 <= puVar45) {
                puVar36 = (ulong *)(pBVar61 + lVar20 + uVar21 + 8);
                puVar45 = (ulong *)((long)puVar35 + lVar20 + 8);
                goto LAB_00216040;
              }
              lVar58 = lVar20 + uVar21 + 8;
              uVar51 = *puVar45;
              lVar20 = lVar20 + 8;
            } while (*(ulong *)(pBVar61 + lVar58) == uVar51);
            uVar51 = uVar51 ^ *(ulong *)(pBVar61 + lVar58);
            uVar21 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar20;
          }
          else {
            uVar51 = *puVar35 ^ *puVar36;
            uVar21 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = uVar21 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00216040:
          if ((puVar45 < puVar19) && ((uint)*puVar36 == (uint)*puVar45)) {
            puVar45 = (ulong *)((long)puVar45 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar45 < puVar33) && ((short)*puVar36 == (short)*puVar45)) {
            puVar45 = (ulong *)((long)puVar45 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar45 < puVar1) {
            puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
          }
          uVar21 = (long)puVar45 - (long)puVar35;
        }
        if (uVar21 < 3) goto LAB_002160c2;
        pZVar8->off = (uVar49 - UVar15) + 2;
        pZVar8->len = (U32)uVar21;
        if ((uVar21 <= uVar13) &&
           (uVar60 = 1, uVar50 = uVar21, (ulong *)((long)puVar35 + uVar21) != puVar1))
        goto LAB_002160c2;
        UVar15 = uVar49 + 1;
        uVar37 = 1;
      }
      else {
LAB_002160c2:
        uVar37 = (uint)uVar60;
        pUVar23[uVar55] = uVar49;
        if (uVar32 <= uVar39) {
          uVar13 = ~(-1 << ((byte)local_198 & 0x1f));
          uVar51 = 0;
          uVar21 = 0;
          do {
            uVar52 = (ulong)uVar39;
            uVar56 = uVar21;
            if (uVar51 < uVar21) {
              uVar56 = uVar51;
            }
            puVar45 = (ulong *)((long)puVar35 + uVar56);
            puVar36 = (ulong *)(pBVar61 + uVar56 + uVar52);
            puVar25 = puVar45;
            if (puVar45 < puVar18) {
              if (*puVar36 == *puVar45) {
                lVar20 = 0;
                do {
                  puVar25 = (ulong *)((long)puVar35 + lVar20 + uVar56 + 8);
                  if (puVar18 <= puVar25) {
                    puVar36 = (ulong *)(pBVar61 + uVar52 + uVar56 + lVar20 + 8);
                    goto LAB_00218633;
                  }
                  lVar58 = lVar20 + uVar52 + uVar56 + 8;
                  lVar20 = lVar20 + 8;
                } while (*(ulong *)(pBVar61 + lVar58) == *puVar25);
                uVar46 = *puVar25 ^ *(ulong *)(pBVar61 + lVar58);
                uVar47 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar20;
              }
              else {
                uVar46 = *puVar45 ^ *puVar36;
                uVar47 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                uVar47 = uVar47 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00218633:
              if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar36 = (ulong *)((long)puVar36 + 4);
              }
              if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar36 = (ulong *)((long)puVar36 + 2);
              }
              if (puVar25 < puVar1) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
              }
              uVar47 = (long)puVar25 - (long)puVar45;
            }
            uVar47 = uVar47 + uVar56;
            if (uVar50 < uVar47) {
              iVar68 = uVar39 + (U32)uVar47;
              if (uVar47 <= iVar28 - uVar39) {
                iVar68 = iVar28;
              }
              iVar28 = iVar68;
              pZVar8[uVar60].off = (uVar49 + 2) - uVar39;
              pZVar8[uVar60].len = (U32)uVar47;
              uVar37 = (int)uVar60 + 1;
              uVar60 = (ulong)uVar37;
              if ((0x1000 < uVar47) ||
                 (uVar50 = uVar47, (ulong *)((long)puVar35 + uVar47) == puVar1)) break;
            }
            uVar37 = (uint)uVar60;
            puVar45 = (ulong *)(pUVar62 + (uVar39 & uVar54) * 2);
            if (pBVar61[uVar47 + uVar52] < *(byte *)((long)puVar35 + uVar47)) {
              *(uint *)local_250 = uVar39;
              if (uVar39 <= uVar27) {
                local_250 = &local_168;
                break;
              }
              puVar45 = (ulong *)((long)puVar45 + 4);
              uVar51 = uVar47;
              local_250 = puVar45;
            }
            else {
              *(uint *)local_260 = uVar39;
              uVar21 = uVar47;
              local_260 = puVar45;
              if (uVar39 <= uVar27) {
                local_260 = &local_168;
                break;
              }
            }
            bVar63 = uVar13 == 0;
            uVar13 = uVar13 - 1;
            if ((bVar63) || (uVar39 = (uint)*puVar45, uVar39 < uVar32)) break;
          } while( true );
        }
        *(uint *)local_260 = 0;
        *(uint *)local_250 = 0;
        UVar15 = iVar28 - 8;
      }
      ms->nextToUpdate = UVar15;
      goto LAB_00216106;
    }
    uVar21 = (ulong)((int)local_190 == 0);
    uVar13 = (ms->cParams).targetLength;
    if (0xffe < uVar13) {
      uVar13 = 0xfff;
    }
    pBVar61 = (ms->window).base;
    uVar54 = iVar64 - (int)pBVar61;
    uVar60 = 0;
    uVar55 = (uint)*puVar35 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
    uVar49 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar27 = uVar54 - uVar49;
    if (uVar54 < uVar49) {
      uVar27 = 0;
    }
    UVar15 = (ms->window).lowLimit;
    uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar14 = uVar54 - uVar37;
    if (uVar54 - UVar15 <= uVar37) {
      UVar14 = UVar15;
    }
    pUVar62 = ms->chainTable;
    if (ms->loadedDictEnd != 0) {
      UVar14 = UVar15;
    }
    uVar32 = UVar14 + (UVar14 == 0);
    uVar51 = (ulong)((uVar49 & uVar54) * 2);
    local_220 = (ulong *)(pUVar62 + uVar51);
    local_260 = (ulong *)(pUVar62 + uVar51 + 1);
    UVar15 = (ms->window).dictLimit;
    pUVar23 = ms->hashTable;
    uVar39 = pUVar23[uVar55];
    iVar28 = uVar54 + 9;
    uVar38 = (ms->cParams).searchLog;
    local_198 = (uint *)CONCAT44(local_198._4_4_,uVar38);
    uVar51 = uVar21 + 3;
    puVar45 = (ulong *)((long)puVar35 + 4);
    uVar50 = (ulong)local_108;
    do {
      if (uVar21 == 3) {
        UVar17 = (U32)*local_128 - 1;
      }
      else {
        UVar17 = *(U32 *)((long)local_128 + uVar21 * 4);
      }
      uVar56 = 0;
      if (((UVar17 - 1 < uVar54 - UVar15) && (UVar14 <= uVar54 - UVar17)) &&
         ((uint)*puVar35 == *(uint *)((long)puVar35 - (ulong)UVar17))) {
        lVar20 = -(ulong)UVar17;
        puVar36 = (ulong *)((long)puVar45 + lVar20);
        puVar25 = puVar45;
        if (puVar45 < puVar18) {
          if (*puVar36 == *puVar45) {
            lVar20 = lVar20 + 0xc;
            lVar58 = 0;
            do {
              puVar25 = (ulong *)((long)puVar35 + lVar58 + 0xc);
              if (puVar18 <= puVar25) {
                puVar36 = (ulong *)((long)puVar35 + lVar58 + lVar20);
                goto LAB_00215a76;
              }
              uVar56 = *(ulong *)((long)puVar35 + lVar58 + lVar20);
              lVar58 = lVar58 + 8;
            } while (uVar56 == *puVar25);
            uVar56 = *puVar25 ^ uVar56;
            uVar52 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            uVar37 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar58;
          }
          else {
            uVar52 = *puVar45 ^ *puVar36;
            uVar56 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
              }
            }
            uVar37 = (uint)(uVar56 >> 3) & 0x1fffffff;
          }
        }
        else {
LAB_00215a76:
          if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar25 < puVar1) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
          }
          uVar37 = (int)puVar25 - (int)puVar45;
        }
        uVar56 = (ulong)(uVar37 + 4);
      }
      if (uVar50 < uVar56) {
        pZVar8[uVar60].off = (int)uVar21 - (uint)((int)local_190 == 0);
        pZVar8[uVar60].len = (uint)uVar56;
        uVar37 = (int)uVar60 + 1;
        uVar60 = (ulong)uVar37;
        if ((uVar13 < (uint)uVar56) ||
           (uVar50 = uVar56, (ulong *)((long)puVar35 + uVar56) == puVar1)) goto LAB_00216106;
      }
      uVar37 = (uint)uVar60;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar51);
    pUVar23[uVar55] = uVar54;
    if (uVar32 <= uVar39) {
      uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
      uVar21 = 0;
      uVar51 = 0;
      do {
        uVar52 = (ulong)uVar39;
        uVar56 = uVar51;
        if (uVar21 < uVar51) {
          uVar56 = uVar21;
        }
        puVar45 = (ulong *)((long)puVar35 + uVar56);
        puVar36 = (ulong *)(pBVar61 + uVar56 + uVar52);
        puVar25 = puVar45;
        if (puVar45 < puVar18) {
          if (*puVar36 == *puVar45) {
            lVar20 = 0;
            do {
              puVar25 = (ulong *)((long)puVar35 + lVar20 + uVar56 + 8);
              if (puVar18 <= puVar25) {
                puVar36 = (ulong *)(pBVar61 + uVar52 + uVar56 + lVar20 + 8);
                goto LAB_00215e85;
              }
              lVar58 = lVar20 + uVar52 + uVar56 + 8;
              lVar20 = lVar20 + 8;
            } while (*(ulong *)(pBVar61 + lVar58) == *puVar25);
            uVar46 = *puVar25 ^ *(ulong *)(pBVar61 + lVar58);
            uVar47 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar20;
          }
          else {
            uVar46 = *puVar45 ^ *puVar36;
            uVar47 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            uVar47 = uVar47 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00215e85:
          if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar25 < puVar1) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
          }
          uVar47 = (long)puVar25 - (long)puVar45;
        }
        uVar47 = uVar47 + uVar56;
        if (uVar50 < uVar47) {
          iVar68 = uVar39 + (U32)uVar47;
          if (uVar47 <= iVar28 - uVar39) {
            iVar68 = iVar28;
          }
          pZVar8[uVar60].off = (uVar54 + 2) - uVar39;
          pZVar8[uVar60].len = (U32)uVar47;
          uVar37 = (int)uVar60 + 1;
          uVar60 = (ulong)uVar37;
          iVar28 = iVar68;
          if ((0x1000 < uVar47) || (uVar50 = uVar47, (ulong *)((long)puVar35 + uVar47) == puVar1))
          break;
        }
        uVar37 = (uint)uVar60;
        puVar45 = (ulong *)(pUVar62 + (uVar39 & uVar49) * 2);
        if (pBVar61[uVar47 + uVar52] < *(byte *)((long)puVar35 + uVar47)) {
          *(uint *)local_220 = uVar39;
          if (uVar39 <= uVar27) {
            local_220 = &local_168;
            break;
          }
          puVar45 = (ulong *)((long)puVar45 + 4);
          uVar21 = uVar47;
          uVar47 = uVar51;
          local_220 = puVar45;
        }
        else {
          *(uint *)local_260 = uVar39;
          local_260 = puVar45;
          if (uVar39 <= uVar27) {
            local_260 = &local_168;
            break;
          }
        }
        bVar63 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if ((bVar63) || (uVar39 = (uint)*puVar45, uVar51 = uVar47, uVar39 < uVar32)) break;
      } while( true );
    }
    *(uint *)local_260 = 0;
    goto LAB_00215b51;
  }
  goto LAB_00216106;
LAB_00212118:
  local_1c8 = &local_1a4;
  goto LAB_00211998;
LAB_002120fe:
  local_258 = &local_1a4;
LAB_00211998:
  *local_1c8 = 0;
  local_250 = (ulong *)local_258;
LAB_00211c68:
  *(uint *)local_250 = 0;
  ms->nextToUpdate = iVar28 - 8;
LAB_0021224f:
  puVar45 = local_e0;
  local_10c = uVar37;
  ZSTD_optLdm_processMatchCandidate
            ((ZSTD_optLdm_t *)local_98,pZVar8,&local_10c,iVar64 - (int)local_e0,
             (int)puVar18 - iVar64);
  uVar13 = local_10c;
  pUVar62 = (U32 *)(ulong)local_10c;
  if (pUVar62 == (U32 *)0x0) {
    puVar40 = (ulong *)((long)puVar40 + 1);
    local_1b8 = (ulong *)src;
    goto LAB_002146f5;
  }
  local_b8[2] = local_160;
  *(ulong *)local_b8 = local_168;
  pZVar59->mlen = 0;
  pZVar59->litlen = (U32)local_190;
  UVar15 = ZSTD_litLengthPrice((U32)local_190,poVar2,2);
  pZVar59->price = UVar15;
  uVar37 = pZVar8[uVar13 - 1].len;
  if ((uint)local_118 < uVar37) {
    UVar14 = pZVar8[uVar13 - 1].off;
    uVar21 = 0;
LAB_00214350:
    pUVar62 = pZVar59[uVar21].rep;
    if (UVar14 < 3) {
      uVar13 = ((int)local_190 == 0) + UVar14;
      if (uVar13 == 0) {
        uVar60 = *(ulong *)pUVar62;
        uVar51 = uVar60 >> 0x20;
        pUVar62 = pZVar59[uVar21].rep + 2;
      }
      else {
        if (uVar13 == 3) {
          uVar49 = *pUVar62;
          uVar27 = uVar49 - 1;
        }
        else {
          uVar27 = pUVar62[uVar13];
          uVar49 = *pUVar62;
        }
        uVar60 = (ulong)uVar27;
        uVar51 = (ulong)uVar49;
        pUVar62 = pUVar62 + (ulong)(uVar13 == 1) + 1;
      }
    }
    else {
      uVar51 = (ulong)*pUVar62;
      pUVar62 = pZVar59[uVar21].rep + 1;
      uVar60 = (ulong)(UVar14 - 2);
    }
    local_160 = *pUVar62;
    local_168 = uVar60 & 0xffffffff | uVar51 << 0x20;
  }
  else {
    UVar14 = ZSTD_litLengthPrice(0,poVar2,2);
    auVar67 = _DAT_00261a10;
    auVar72 = _DAT_0025e440;
    auVar65 = _DAT_0025e430;
    uVar21 = 0;
    pZVar29 = local_120;
    do {
      auVar66._8_4_ = (int)uVar21;
      auVar66._0_8_ = uVar21;
      auVar66._12_4_ = (int)(uVar21 >> 0x20);
      auVar70 = (auVar66 | auVar65) ^ auVar72;
      bVar63 = (int)local_48._0_4_ < auVar70._0_4_;
      iVar64 = auVar70._4_4_;
      if ((bool)(~((int)local_48._4_4_ < iVar64 || iVar64 == local_48._4_4_ && bVar63) & 1)) {
        pZVar29[-3].price = 0x40000000;
      }
      if ((int)local_48._4_4_ >= iVar64 && (iVar64 != local_48._4_4_ || !bVar63)) {
        pZVar29[-2].price = 0x40000000;
      }
      auVar66 = (auVar66 | auVar67) ^ auVar72;
      iVar64 = auVar66._4_4_;
      if (iVar64 <= (int)local_48._4_4_ &&
          (iVar64 != local_48._4_4_ || auVar66._0_4_ <= (int)local_48._0_4_)) {
        pZVar29[-1].price = 0x40000000;
        pZVar29->price = 0x40000000;
      }
      uVar21 = uVar21 + 4;
      pZVar29 = pZVar29 + 4;
    } while (local_c0 != uVar21);
    piVar34 = (int *)0x0;
    uVar21 = (ulong)uVar26;
    do {
      uVar13 = pZVar8[(long)piVar34].len;
      if ((uint)uVar21 <= uVar13) {
        UVar17 = pZVar8[(long)piVar34].off;
        uVar27 = UVar17 + 1;
        uVar37 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar37 == 0; uVar37 = uVar37 - 1) {
          }
        }
        ZVar6 = (ms->opt).priceType;
        uVar27 = (uint)uVar21 * 0x100 - 0x200;
        do {
          UVar43 = (U32)uVar21;
          if (ZVar6 == zop_predef) {
            iVar64 = 0x1f;
            if (UVar43 - 2 != 0) {
              for (; UVar43 - 2 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            iVar64 = (iVar64 + uVar37) * 0x100 + (uVar27 >> ((byte)iVar64 & 0x1f)) + 0x1000;
          }
          else {
            uVar54 = UVar43 - 3;
            uVar49 = (ms->opt).offCodeFreq[uVar37] + 1;
            iVar64 = 0x1f;
            if (uVar49 != 0) {
              for (; uVar49 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            if (uVar54 < 0x80) {
              uVar54 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar54];
            }
            else {
              uVar55 = 0x1f;
              if (uVar54 != 0) {
                for (; uVar54 >> uVar55 == 0; uVar55 = uVar55 - 1) {
                }
              }
              uVar54 = (uVar55 ^ 0xffffffe0) + 0x44;
            }
            uVar55 = (ms->opt).matchLengthFreq[uVar54] + 1;
            iVar28 = 0x1f;
            if (uVar55 != 0) {
              for (; uVar55 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            iVar64 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar49 * 0x100 >> ((byte)iVar64 & 0x1f)) +
                     (uVar55 * 0x100 >> ((byte)iVar28 & 0x1f)))) +
                     ((ML_bits[uVar54] + uVar37) - (iVar64 + iVar28)) * 0x100 + 0x33;
          }
          pZVar59[uVar21].mlen = UVar43;
          pZVar59[uVar21].off = UVar17;
          pZVar59[uVar21].litlen = (U32)local_190;
          pZVar59[uVar21].price = iVar64 + UVar14 + UVar15;
          uVar21 = (ulong)(UVar43 + 1);
          uVar27 = uVar27 + 0x100;
        } while (UVar43 + 1 <= uVar13);
      }
      piVar34 = (int *)((long)piVar34 + 1);
    } while ((U32 *)piVar34 != pUVar62);
    uVar13 = (int)uVar21 - 1;
    uVar21 = (ulong)uVar13;
    if (uVar13 != 0) {
      local_108 = (uint *)((long)puVar40 + 0xc);
      local_a8 = puVar40 + 1;
      local_f8 = (U32 *)((long)puVar40 + 0xb);
      pUVar62 = (U32 *)0x1;
LAB_002125ca:
      uVar13 = (int)pUVar62 - 1;
      local_190 = pZVar59 + uVar13;
      UVar15 = 1;
      if (pZVar59[uVar13].mlen == 0) {
        UVar15 = local_190->litlen + 1;
      }
      puVar45 = (ulong *)((long)pUVar62 + (long)puVar40);
      iVar64 = 0x800;
      if (((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) &&
         (iVar64 = 0x600, (ms->opt).priceType != zop_predef)) {
        uVar13 = (ms->opt).litFreq[*(byte *)((long)puVar45 + -1)] + 1;
        iVar64 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar64 == 0; iVar64 = iVar64 + -1) {
          }
        }
        iVar64 = (ms->opt).litSumBasePrice -
                 (iVar64 * 0x100 + (uVar13 * 0x100 >> ((byte)iVar64 & 0x1f)));
      }
      iVar28 = local_190->price;
      local_1a0 = (ZSTD_optimal_t *)pUVar62;
      UVar14 = ZSTD_litLengthPrice(UVar15,poVar2,2);
      UVar17 = ZSTD_litLengthPrice(UVar15 - 1,poVar2,2);
      iVar68 = (UVar14 + iVar64 + iVar28) - UVar17;
      pZVar29 = pZVar59 + (long)pUVar62;
      iVar64 = pZVar59[(long)pUVar62].price;
      iVar28 = (int)local_1a0;
      if (iVar64 < iVar68) {
        if (pZVar29->mlen == 0) goto LAB_0021273d;
        uVar37 = iVar28 - pZVar29->mlen;
        pUVar23 = pZVar59[uVar37].rep;
        uVar13 = pZVar29->off;
        if (uVar13 < 3) {
          uVar13 = uVar13 + (pZVar29->litlen == 0);
          if (uVar13 == 0) {
            uVar60 = *(ulong *)pUVar23;
            uVar51 = uVar60 >> 0x20;
            pUVar23 = pZVar59[uVar37].rep + 2;
          }
          else {
            if (uVar13 == 3) {
              uVar27 = *pUVar23;
              uVar37 = uVar27 - 1;
            }
            else {
              uVar37 = pUVar23[uVar13];
              uVar27 = *pUVar23;
            }
            uVar60 = (ulong)uVar37;
            uVar51 = (ulong)uVar27;
            pUVar23 = pUVar23 + (ulong)(uVar13 == 1) + 1;
          }
        }
        else {
          uVar51 = (ulong)*pUVar23;
          pUVar23 = pZVar59[uVar37].rep + 1;
          uVar60 = (ulong)(uVar13 - 2);
        }
        UVar15 = *pUVar23;
        *(ulong *)pZVar29->rep = uVar60 & 0xffffffff | uVar51 << 0x20;
        pZVar29->rep[2] = UVar15;
        uVar13 = 1;
        bVar63 = false;
      }
      else {
        pZVar29->off = 0;
        pZVar29->mlen = 0;
        pZVar29->litlen = UVar15;
        pZVar29->price = iVar68;
        iVar64 = iVar68;
LAB_0021273d:
        pZVar29->rep[2] = local_190->rep[2];
        *(undefined8 *)pZVar29->rep = *(undefined8 *)local_190->rep;
        bVar63 = true;
        uVar13 = 0;
      }
      if (local_130 < puVar45) goto LAB_00213ccd;
      if (iVar28 != (int)uVar21) {
        local_190 = (ZSTD_optimal_t *)0x0;
        if (bVar63) {
          local_190 = (ZSTD_optimal_t *)(ulong)pZVar29->litlen;
        }
        UVar15 = ZSTD_litLengthPrice(0,poVar2,2);
        pBVar61 = (ms->window).base;
        uVar37 = ms->nextToUpdate;
        uVar60 = (ulong)uVar37;
        iVar68 = (int)puVar45;
        pUVar23 = (U32 *)local_1a0;
        if (pBVar61 + uVar60 <= puVar45) {
          UVar14 = (ms->cParams).minMatch;
          uVar27 = iVar68 - (int)pBVar61;
          while (local_1a0 = (ZSTD_optimal_t *)pUVar23, local_f0 = uVar21, uVar37 < uVar27) {
            UVar17 = ZSTD_insertBt1(ms,pBVar61 + uVar60,(BYTE *)puVar18,UVar14,0);
            uVar37 = (int)uVar60 + UVar17;
            uVar60 = (ulong)uVar37;
            uVar21 = local_f0;
            pUVar23 = (U32 *)local_1a0;
          }
          lVar20 = (long)local_108 + (long)pUVar62;
          local_178 = (ulong *)((long)local_a8 + (long)pUVar62);
          ms->nextToUpdate = uVar27;
          local_180._4_4_ = (undefined4)((ulong)local_180 >> 0x20);
          local_138._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
          local_198._4_4_ = (undefined4)((ulong)local_198 >> 0x20);
          local_140._4_4_ = (undefined4)((ulong)local_140 >> 0x20);
          if (UVar14 - 6 < 2) {
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            pBVar61 = (ms->window).base;
            uVar54 = iVar68 - (int)pBVar61;
            uVar49 = 0;
            local_188 = (U32 *)(*puVar45 * -0x30e4432340650000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar55 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar27 = uVar54 - uVar55;
            if (uVar54 < uVar55) {
              uVar27 = 0;
            }
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar27);
            uVar38 = (ms->window).lowLimit;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar39 = uVar54 - uVar32;
            if (uVar54 - uVar38 <= uVar32) {
              uVar39 = uVar38;
            }
            local_150 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              uVar39 = uVar38;
            }
            uVar53 = uVar39 + (uVar39 == 0);
            local_198 = (uint *)CONCAT44(local_198._4_4_,uVar53);
            local_138 = CONCAT44(local_138._4_4_,uVar55);
            uVar50 = (ulong)((uVar55 & uVar54) * 2);
            local_230 = local_150 + uVar50;
            UVar14 = (ms->window).dictLimit;
            uVar51 = (ulong)uVar13;
            local_158 = (ulong *)ms->hashTable;
            uVar32 = *(uint *)((long)local_158 + (long)local_188 * 4);
            iVar28 = uVar54 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_140 = (U32 *)CONCAT44(local_140._4_4_,uVar38);
            uVar60 = uVar51 + 3;
            puVar33 = (ulong *)((long)puVar45 + 4);
            pUVar62 = local_100;
            do {
              if (uVar51 == 3) {
                uVar16 = pZVar29->rep[0] - 1;
              }
              else {
                uVar16 = pZVar29->rep[uVar51];
              }
              pUVar22 = (U32 *)0x0;
              if (((uVar16 - 1 < uVar54 - UVar14) && (uVar39 <= uVar54 - uVar16)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar16))) {
                lVar58 = -(ulong)uVar16;
                puVar36 = (ulong *)((long)puVar33 + lVar58);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar58 = lVar58 + lVar20;
                    lVar41 = 0;
                    do {
                      puVar25 = (ulong *)(lVar20 + lVar41);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(lVar58 + lVar41);
                        goto LAB_00212e81;
                      }
                      uVar56 = *(ulong *)(lVar58 + lVar41);
                      lVar41 = lVar41 + 8;
                    } while (uVar56 == *puVar25);
                    uVar56 = *puVar25 ^ uVar56;
                    uVar52 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar16 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar41;
                  }
                  else {
                    uVar52 = *puVar33 ^ *puVar36;
                    uVar56 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    uVar16 = (uint)(uVar56 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00212e81:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar16 = (int)puVar25 - (int)puVar33;
                }
                pUVar22 = (U32 *)(ulong)(uVar16 + 4);
              }
              if (pUVar62 < pUVar22) {
                pZVar8[uVar49].off = (int)uVar51 - uVar13;
                pZVar8[uVar49].len = (uint)pUVar22;
                uVar49 = uVar49 + 1;
                if ((uVar37 < (uint)pUVar22) ||
                   (pUVar62 = pUVar22, (ulong *)((long)puVar45 + (long)pUVar22) == puVar18))
                goto LAB_0021397d;
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 < uVar60);
            *(uint *)((long)local_158 + (long)local_188 * 4) = uVar54;
            local_1d0 = local_150 + uVar50 + 1;
            if (uVar53 <= uVar32) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              local_1e8 = (U32 *)0x0;
              pUVar22 = (U32 *)0x0;
              iVar69 = iVar28;
              do {
                uVar60 = (ulong)uVar32;
                pUVar44 = pUVar22;
                if (local_1e8 < pUVar22) {
                  pUVar44 = local_1e8;
                }
                puVar33 = (ulong *)((long)puVar45 + (long)pUVar44);
                puVar36 = (ulong *)(pBVar61 + uVar60 + (long)pUVar44);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar20 = 0;
                    do {
                      puVar25 = (ulong *)((long)local_178 + (long)pUVar44 + lVar20);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(pBVar61 + (long)pUVar44 + lVar20 + 8 + uVar60);
                        goto LAB_0021303f;
                      }
                      lVar58 = lVar20 + uVar60 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(pBVar61 + (long)pUVar44 + lVar58) == *puVar25);
                    uVar50 = *puVar25 ^ *(ulong *)(pBVar61 + (long)pUVar44 + lVar58);
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar50 = *puVar33 ^ *puVar36;
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = uVar51 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0021303f:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar51 = (long)puVar25 - (long)puVar33;
                }
                pUVar44 = (U32 *)(uVar51 + (long)pUVar44);
                iVar28 = iVar69;
                if (pUVar62 < pUVar44) {
                  iVar28 = uVar32 + (U32)pUVar44;
                  if (pUVar44 <= (int *)(ulong)(iVar69 - uVar32)) {
                    iVar28 = iVar69;
                  }
                  pZVar8[uVar49].off = (uVar54 + 2) - uVar32;
                  pZVar8[uVar49].len = (U32)pUVar44;
                  uVar49 = uVar49 + 1;
                  if (((U32 *)0x1000 < pUVar44) ||
                     (pUVar62 = pUVar44, (ulong *)((long)puVar45 + (long)pUVar44) == puVar18))
                  break;
                }
                puVar30 = local_150 + (uVar32 & uVar55) * 2;
                if ((pBVar61 + uVar60)[(long)pUVar44] < *(byte *)((long)puVar45 + (long)pUVar44)) {
                  *local_230 = uVar32;
                  if (uVar32 <= uVar27) goto LAB_002141de;
                  local_230 = puVar30 + 1;
                  puVar30 = local_1d0;
                  puVar31 = local_230;
                  local_1e8 = pUVar44;
                }
                else {
                  *local_1d0 = uVar32;
                  puVar31 = puVar30;
                  pUVar22 = pUVar44;
                  if (uVar32 <= uVar27) goto LAB_002141d1;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                local_1d0 = puVar30;
                if ((bVar63) || (uVar32 = *puVar31, iVar69 = iVar28, uVar32 < uVar53)) break;
              } while( true );
            }
          }
          else if (UVar14 == 5) {
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            pBVar61 = (ms->window).base;
            uVar54 = iVar68 - (int)pBVar61;
            uVar49 = 0;
            local_188 = (U32 *)(*puVar45 * -0x30e4432345000000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar55 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar27 = uVar54 - uVar55;
            if (uVar54 < uVar55) {
              uVar27 = 0;
            }
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar27);
            uVar38 = (ms->window).lowLimit;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar39 = uVar54 - uVar32;
            if (uVar54 - uVar38 <= uVar32) {
              uVar39 = uVar38;
            }
            local_150 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              uVar39 = uVar38;
            }
            uVar53 = uVar39 + (uVar39 == 0);
            local_198 = (uint *)CONCAT44(local_198._4_4_,uVar53);
            local_138 = CONCAT44(local_138._4_4_,uVar55);
            uVar50 = (ulong)((uVar55 & uVar54) * 2);
            local_230 = local_150 + uVar50;
            UVar14 = (ms->window).dictLimit;
            uVar51 = (ulong)uVar13;
            local_158 = (ulong *)ms->hashTable;
            uVar32 = *(uint *)((long)local_158 + (long)local_188 * 4);
            iVar28 = uVar54 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_140 = (U32 *)CONCAT44(local_140._4_4_,uVar38);
            uVar60 = uVar51 + 3;
            puVar33 = (ulong *)((long)puVar45 + 4);
            pUVar62 = local_100;
            do {
              if (uVar51 == 3) {
                uVar16 = pZVar29->rep[0] - 1;
              }
              else {
                uVar16 = pZVar29->rep[uVar51];
              }
              pUVar22 = (U32 *)0x0;
              if (((uVar16 - 1 < uVar54 - UVar14) && (uVar39 <= uVar54 - uVar16)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar16))) {
                lVar58 = -(ulong)uVar16;
                puVar36 = (ulong *)((long)puVar33 + lVar58);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar58 = lVar58 + lVar20;
                    lVar41 = 0;
                    do {
                      puVar25 = (ulong *)(lVar20 + lVar41);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(lVar58 + lVar41);
                        goto LAB_00213392;
                      }
                      uVar56 = *(ulong *)(lVar58 + lVar41);
                      lVar41 = lVar41 + 8;
                    } while (uVar56 == *puVar25);
                    uVar56 = *puVar25 ^ uVar56;
                    uVar52 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar16 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar41;
                  }
                  else {
                    uVar52 = *puVar33 ^ *puVar36;
                    uVar56 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    uVar16 = (uint)(uVar56 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00213392:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar16 = (int)puVar25 - (int)puVar33;
                }
                pUVar22 = (U32 *)(ulong)(uVar16 + 4);
              }
              if (pUVar62 < pUVar22) {
                pZVar8[uVar49].off = (int)uVar51 - uVar13;
                pZVar8[uVar49].len = (uint)pUVar22;
                uVar49 = uVar49 + 1;
                if ((uVar37 < (uint)pUVar22) ||
                   (pUVar62 = pUVar22, (ulong *)((long)puVar45 + (long)pUVar22) == puVar18))
                goto LAB_0021397d;
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 < uVar60);
            *(uint *)((long)local_158 + (long)local_188 * 4) = uVar54;
            local_1d0 = local_150 + uVar50 + 1;
            if (uVar53 <= uVar32) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              local_1e8 = (U32 *)0x0;
              pUVar22 = (U32 *)0x0;
              iVar69 = iVar28;
              do {
                uVar60 = (ulong)uVar32;
                pUVar44 = pUVar22;
                if (local_1e8 < pUVar22) {
                  pUVar44 = local_1e8;
                }
                puVar33 = (ulong *)((long)puVar45 + (long)pUVar44);
                puVar36 = (ulong *)(pBVar61 + uVar60 + (long)pUVar44);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar20 = 0;
                    do {
                      puVar25 = (ulong *)((long)local_178 + (long)pUVar44 + lVar20);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(pBVar61 + (long)pUVar44 + lVar20 + 8 + uVar60);
                        goto LAB_00213546;
                      }
                      lVar58 = lVar20 + uVar60 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(pBVar61 + (long)pUVar44 + lVar58) == *puVar25);
                    uVar50 = *puVar25 ^ *(ulong *)(pBVar61 + (long)pUVar44 + lVar58);
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar50 = *puVar33 ^ *puVar36;
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = uVar51 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00213546:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar51 = (long)puVar25 - (long)puVar33;
                }
                pUVar44 = (U32 *)(uVar51 + (long)pUVar44);
                iVar28 = iVar69;
                if (pUVar62 < pUVar44) {
                  iVar28 = uVar32 + (U32)pUVar44;
                  if (pUVar44 <= (int *)(ulong)(iVar69 - uVar32)) {
                    iVar28 = iVar69;
                  }
                  pZVar8[uVar49].off = (uVar54 + 2) - uVar32;
                  pZVar8[uVar49].len = (U32)pUVar44;
                  uVar49 = uVar49 + 1;
                  if (((U32 *)0x1000 < pUVar44) ||
                     (pUVar62 = pUVar44, (ulong *)((long)puVar45 + (long)pUVar44) == puVar18))
                  break;
                }
                puVar30 = local_150 + (uVar32 & uVar55) * 2;
                if ((pBVar61 + uVar60)[(long)pUVar44] < *(byte *)((long)puVar45 + (long)pUVar44)) {
                  *local_230 = uVar32;
                  if (uVar32 <= uVar27) goto LAB_002141de;
                  local_230 = puVar30 + 1;
                  puVar30 = local_1d0;
                  puVar31 = local_230;
                  local_1e8 = pUVar44;
                }
                else {
                  *local_1d0 = uVar32;
                  puVar31 = puVar30;
                  pUVar22 = pUVar44;
                  if (uVar32 <= uVar27) goto LAB_002141d1;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                local_1d0 = puVar30;
                if ((bVar63) || (uVar32 = *puVar31, iVar69 = iVar28, uVar32 < uVar53)) break;
              } while( true );
            }
          }
          else {
            if (UVar14 == 3) {
              uVar37 = (ms->cParams).targetLength;
              if (0xffe < uVar37) {
                uVar37 = 0xfff;
              }
              pBVar61 = (ms->window).base;
              uVar27 = iVar68 - (int)pBVar61;
              uVar49 = 0;
              local_158 = (ulong *)(ulong)((uint)*puVar45 * -0x61c8864f >>
                                          (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar28 = uVar27 - uVar54;
              if (uVar27 < uVar54) {
                iVar28 = 0;
              }
              local_180 = (BYTE *)CONCAT44(local_180._4_4_,iVar28);
              uVar55 = (ms->window).lowLimit;
              uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar38 = uVar27 - uVar39;
              if (uVar27 - uVar55 <= uVar39) {
                uVar38 = uVar55;
              }
              local_150 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar38 = uVar55;
              }
              uVar55 = uVar38 + (uVar38 == 0);
              local_138 = CONCAT44(local_138._4_4_,uVar54);
              uVar60 = (ulong)((uVar54 & uVar27) * 2);
              local_198 = local_150 + uVar60;
              local_210 = local_150 + uVar60 + 1;
              UVar14 = (ms->window).dictLimit;
              uVar51 = (ulong)uVar13;
              local_140 = ms->hashTable;
              local_188 = (U32 *)(ulong)local_140[(long)local_158];
              iVar28 = uVar27 + 9;
              local_58._0_4_ = (ms->cParams).searchLog;
              uVar60 = uVar51 + 3;
              puVar33 = (ulong *)((long)puVar45 + 3);
              local_1e8 = local_100;
              do {
                if (uVar51 == 3) {
                  UVar17 = pZVar29->rep[0] - 1;
                }
                else {
                  UVar17 = pZVar29->rep[uVar51];
                }
                pUVar22 = (U32 *)0x0;
                if (((UVar17 - 1 < uVar27 - UVar14) && (uVar38 <= uVar27 - UVar17)) &&
                   (((*(uint *)((long)puVar45 - (ulong)UVar17) ^ (uint)*puVar45) & 0xffffff) == 0))
                {
                  lVar20 = -(ulong)UVar17;
                  puVar36 = (ulong *)((long)puVar33 + lVar20);
                  puVar25 = puVar33;
                  if (puVar33 < puVar1) {
                    if (*puVar36 == *puVar33) {
                      lVar20 = lVar20 + (long)pUVar62 + (long)local_f8;
                      lVar58 = 0;
                      do {
                        puVar25 = (ulong *)((long)pUVar62 + (long)local_f8 + lVar58);
                        if (puVar1 <= puVar25) {
                          puVar36 = (ulong *)(lVar20 + lVar58);
                          goto LAB_00212af6;
                        }
                        uVar50 = *(ulong *)(lVar20 + lVar58);
                        lVar58 = lVar58 + 8;
                      } while (uVar50 == *puVar25);
                      uVar50 = *puVar25 ^ uVar50;
                      uVar56 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                        }
                      }
                      uVar54 = ((uint)(uVar56 >> 3) & 0x1fffffff) + (int)lVar58;
                    }
                    else {
                      uVar56 = *puVar33 ^ *puVar36;
                      uVar50 = 0;
                      if (uVar56 != 0) {
                        for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                        }
                      }
                      uVar54 = (uint)(uVar50 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_00212af6:
                    if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                      puVar25 = (ulong *)((long)puVar25 + 4);
                      puVar36 = (ulong *)((long)puVar36 + 4);
                    }
                    if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                      puVar25 = (ulong *)((long)puVar25 + 2);
                      puVar36 = (ulong *)((long)puVar36 + 2);
                    }
                    if (puVar25 < puVar18) {
                      puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25))
                      ;
                    }
                    uVar54 = (int)puVar25 - (int)puVar33;
                  }
                  pUVar22 = (U32 *)(ulong)(uVar54 + 3);
                }
                if (local_1e8 < pUVar22) {
                  pZVar8[uVar49].off = (int)uVar51 - uVar13;
                  pZVar8[uVar49].len = (uint)pUVar22;
                  uVar49 = uVar49 + 1;
                  if ((uVar37 < (uint)pUVar22) ||
                     (local_1e8 = pUVar22, (ulong *)((long)puVar45 + (long)pUVar22) == puVar18))
                  goto LAB_0021397d;
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 < uVar60);
              if (((local_1e8 < (U32 *)0x3) &&
                  (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_144,(BYTE *)puVar45),
                  uVar55 <= UVar14)) && (uVar27 - UVar14 < 0x40000)) {
                uVar60 = (ulong)UVar14;
                puVar33 = (ulong *)(pBVar61 + uVar60);
                puVar36 = puVar45;
                if (puVar45 < puVar1) {
                  if (*puVar33 == *puVar45) {
                    lVar20 = 0;
                    do {
                      puVar36 = (ulong *)((long)local_178 + lVar20);
                      if (puVar1 <= puVar36) {
                        puVar33 = (ulong *)(pBVar61 + lVar20 + uVar60 + 8);
                        goto LAB_00214251;
                      }
                      lVar58 = lVar20 + uVar60 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(pBVar61 + lVar58) == *puVar36);
                    uVar51 = *puVar36 ^ *(ulong *)(pBVar61 + lVar58);
                    uVar60 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                      }
                    }
                    pUVar62 = (U32 *)((uVar60 >> 3 & 0x1fffffff) + lVar20);
                  }
                  else {
                    uVar51 = *puVar45 ^ *puVar33;
                    uVar60 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                      }
                    }
                    pUVar62 = (U32 *)(uVar60 >> 3 & 0x1fffffff);
                  }
                }
                else {
LAB_00214251:
                  if ((puVar36 < puVar35) && ((uint)*puVar33 == (uint)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar36 < local_170) && ((short)*puVar33 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar36 < puVar18) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar33 == (char)*puVar36));
                  }
                  pUVar62 = (U32 *)((long)puVar36 - (long)puVar45);
                }
                if (pUVar62 < (U32 *)0x3) goto LAB_00213ceb;
                pZVar8->off = (uVar27 - UVar14) + 2;
                pZVar8->len = (U32)pUVar62;
                if ((pUVar62 <= (int *)(ulong)uVar37) &&
                   (uVar49 = 1, local_1e8 = pUVar62,
                   (ulong *)((long)puVar45 + (long)pUVar62) != puVar18)) goto LAB_00213ceb;
                UVar14 = uVar27 + 1;
                uVar49 = 1;
              }
              else {
LAB_00213ceb:
                local_140[(long)local_158] = uVar27;
                if (uVar55 <= (uint)local_188) {
                  uVar13 = ~(-1 << (local_58[0] & 0x1f));
                  pUVar22 = (U32 *)0x0;
                  pUVar62 = (U32 *)0x0;
                  pUVar23 = local_188;
                  do {
                    pUVar44 = pUVar62;
                    if (pUVar22 < pUVar62) {
                      pUVar44 = pUVar22;
                    }
                    uVar37 = (uint)pUVar23;
                    uVar60 = (ulong)pUVar23 & 0xffffffff;
                    puVar33 = (ulong *)((long)puVar45 + (long)pUVar44);
                    puVar36 = (ulong *)(pBVar61 + uVar60 + (long)pUVar44);
                    puVar25 = puVar33;
                    if (puVar33 < puVar1) {
                      if (*puVar36 == *puVar33) {
                        lVar20 = 0;
                        do {
                          puVar25 = (ulong *)((long)local_178 + (long)pUVar44 + lVar20);
                          if (puVar1 <= puVar25) {
                            puVar36 = (ulong *)(pBVar61 + (long)pUVar44 + lVar20 + 8 + uVar60);
                            goto LAB_00214068;
                          }
                          lVar58 = lVar20 + uVar60 + 8;
                          lVar20 = lVar20 + 8;
                        } while (*(ulong *)(pBVar61 + (long)pUVar44 + lVar58) == *puVar25);
                        uVar50 = *puVar25 ^ *(ulong *)(pBVar61 + (long)pUVar44 + lVar58);
                        uVar51 = 0;
                        if (uVar50 != 0) {
                          for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                          }
                        }
                        uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
                      }
                      else {
                        uVar50 = *puVar33 ^ *puVar36;
                        uVar51 = 0;
                        if (uVar50 != 0) {
                          for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                          }
                        }
                        uVar51 = uVar51 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00214068:
                      if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                        puVar25 = (ulong *)((long)puVar25 + 4);
                        puVar36 = (ulong *)((long)puVar36 + 4);
                      }
                      if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                        puVar25 = (ulong *)((long)puVar25 + 2);
                        puVar36 = (ulong *)((long)puVar36 + 2);
                      }
                      if (puVar25 < puVar18) {
                        puVar25 = (ulong *)((long)puVar25 +
                                           (ulong)((char)*puVar36 == (char)*puVar25));
                      }
                      uVar51 = (long)puVar25 - (long)puVar33;
                    }
                    pUVar44 = (U32 *)(uVar51 + (long)pUVar44);
                    if (local_1e8 < pUVar44) {
                      iVar69 = uVar37 + (U32)pUVar44;
                      if (pUVar44 <= (int *)(ulong)(iVar28 - uVar37)) {
                        iVar69 = iVar28;
                      }
                      iVar28 = iVar69;
                      pZVar8[uVar49].off = (uVar27 + 2) - uVar37;
                      pZVar8[uVar49].len = (U32)pUVar44;
                      uVar49 = uVar49 + 1;
                      if (((U32 *)0x1000 < pUVar44) ||
                         (local_1e8 = pUVar44, (ulong *)((long)puVar45 + (long)pUVar44) == puVar18))
                      break;
                    }
                    puVar30 = local_150 + (uVar37 & (uint)local_138) * 2;
                    if ((pBVar61 + uVar60)[(long)pUVar44] < *(byte *)((long)puVar45 + (long)pUVar44)
                       ) {
                      *local_198 = uVar37;
                      if (uVar37 <= (uint)local_180) {
                        local_198 = &local_1a4;
                        break;
                      }
                      puVar30 = puVar30 + 1;
                      pUVar22 = pUVar44;
                      local_198 = puVar30;
                    }
                    else {
                      *local_210 = uVar37;
                      pUVar62 = pUVar44;
                      local_210 = puVar30;
                      if (uVar37 <= (uint)local_180) {
                        local_210 = &local_1a4;
                        break;
                      }
                    }
                    bVar63 = uVar13 == 0;
                    uVar13 = uVar13 - 1;
                    if ((bVar63) || (pUVar23 = (U32 *)(ulong)*puVar30, *puVar30 < uVar55)) break;
                  } while( true );
                }
                *local_210 = 0;
                *local_198 = 0;
                UVar14 = iVar28 - 8;
              }
              ms->nextToUpdate = UVar14;
              pUVar23 = (U32 *)local_1a0;
              goto LAB_0021397d;
            }
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            pBVar61 = (ms->window).base;
            uVar54 = iVar68 - (int)pBVar61;
            uVar49 = 0;
            local_188 = (U32 *)(ulong)((uint)*puVar45 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar55 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar27 = uVar54 - uVar55;
            if (uVar54 < uVar55) {
              uVar27 = 0;
            }
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar27);
            uVar38 = (ms->window).lowLimit;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar39 = uVar54 - uVar32;
            if (uVar54 - uVar38 <= uVar32) {
              uVar39 = uVar38;
            }
            local_150 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              uVar39 = uVar38;
            }
            uVar53 = uVar39 + (uVar39 == 0);
            local_198 = (uint *)CONCAT44(local_198._4_4_,uVar53);
            local_138 = CONCAT44(local_138._4_4_,uVar55);
            uVar50 = (ulong)((uVar55 & uVar54) * 2);
            local_230 = local_150 + uVar50;
            UVar14 = (ms->window).dictLimit;
            uVar51 = (ulong)uVar13;
            local_158 = (ulong *)ms->hashTable;
            uVar32 = *(uint *)((long)local_158 + (long)local_188 * 4);
            iVar28 = uVar54 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_140 = (U32 *)CONCAT44(local_140._4_4_,uVar38);
            uVar60 = uVar51 + 3;
            puVar33 = (ulong *)((long)puVar45 + 4);
            pUVar62 = local_100;
            do {
              if (uVar51 == 3) {
                uVar16 = pZVar29->rep[0] - 1;
              }
              else {
                uVar16 = pZVar29->rep[uVar51];
              }
              pUVar22 = (U32 *)0x0;
              if (((uVar16 - 1 < uVar54 - UVar14) && (uVar39 <= uVar54 - uVar16)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar16))) {
                lVar58 = -(ulong)uVar16;
                puVar36 = (ulong *)((long)puVar33 + lVar58);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar58 = lVar58 + lVar20;
                    lVar41 = 0;
                    do {
                      puVar25 = (ulong *)(lVar20 + lVar41);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(lVar58 + lVar41);
                        goto LAB_00213894;
                      }
                      uVar56 = *(ulong *)(lVar58 + lVar41);
                      lVar41 = lVar41 + 8;
                    } while (uVar56 == *puVar25);
                    uVar56 = *puVar25 ^ uVar56;
                    uVar52 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar16 = ((uint)(uVar52 >> 3) & 0x1fffffff) + (int)lVar41;
                  }
                  else {
                    uVar52 = *puVar33 ^ *puVar36;
                    uVar56 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    uVar16 = (uint)(uVar56 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00213894:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar16 = (int)puVar25 - (int)puVar33;
                }
                pUVar22 = (U32 *)(ulong)(uVar16 + 4);
              }
              if (pUVar62 < pUVar22) {
                pZVar8[uVar49].off = (int)uVar51 - uVar13;
                pZVar8[uVar49].len = (uint)pUVar22;
                uVar49 = uVar49 + 1;
                if ((uVar37 < (uint)pUVar22) ||
                   (pUVar62 = pUVar22, (ulong *)((long)puVar45 + (long)pUVar22) == puVar18))
                goto LAB_0021397d;
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 < uVar60);
            *(uint *)((long)local_158 + (long)local_188 * 4) = uVar54;
            local_1d0 = local_150 + uVar50 + 1;
            if (uVar53 <= uVar32) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              local_1e8 = (U32 *)0x0;
              pUVar22 = (U32 *)0x0;
              iVar69 = iVar28;
              do {
                uVar60 = (ulong)uVar32;
                pUVar44 = pUVar22;
                if (local_1e8 < pUVar22) {
                  pUVar44 = local_1e8;
                }
                puVar33 = (ulong *)((long)puVar45 + (long)pUVar44);
                puVar36 = (ulong *)(pBVar61 + uVar60 + (long)pUVar44);
                puVar25 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar36 == *puVar33) {
                    lVar20 = 0;
                    do {
                      puVar25 = (ulong *)((long)local_178 + (long)pUVar44 + lVar20);
                      if (puVar1 <= puVar25) {
                        puVar36 = (ulong *)(pBVar61 + (long)pUVar44 + lVar20 + 8 + uVar60);
                        goto LAB_00213e20;
                      }
                      lVar58 = lVar20 + uVar60 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(pBVar61 + (long)pUVar44 + lVar58) == *puVar25);
                    uVar50 = *puVar25 ^ *(ulong *)(pBVar61 + (long)pUVar44 + lVar58);
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar50 = *puVar33 ^ *puVar36;
                    uVar51 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uVar51 = uVar51 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00213e20:
                  if ((puVar25 < puVar35) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < local_170) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar18) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar36 == (char)*puVar25));
                  }
                  uVar51 = (long)puVar25 - (long)puVar33;
                }
                pUVar44 = (U32 *)(uVar51 + (long)pUVar44);
                iVar28 = iVar69;
                if (pUVar62 < pUVar44) {
                  iVar28 = uVar32 + (U32)pUVar44;
                  if (pUVar44 <= (int *)(ulong)(iVar69 - uVar32)) {
                    iVar28 = iVar69;
                  }
                  pZVar8[uVar49].off = (uVar54 + 2) - uVar32;
                  pZVar8[uVar49].len = (U32)pUVar44;
                  uVar49 = uVar49 + 1;
                  if (((U32 *)0x1000 < pUVar44) ||
                     (pUVar62 = pUVar44, (ulong *)((long)puVar45 + (long)pUVar44) == puVar18))
                  break;
                }
                puVar30 = local_150 + (uVar32 & uVar55) * 2;
                if ((pBVar61 + uVar60)[(long)pUVar44] < *(byte *)((long)puVar45 + (long)pUVar44)) {
                  *local_230 = uVar32;
                  if (uVar32 <= uVar27) goto LAB_002141de;
                  local_230 = puVar30 + 1;
                  puVar30 = local_1d0;
                  puVar31 = local_230;
                  local_1e8 = pUVar44;
                }
                else {
                  *local_1d0 = uVar32;
                  puVar31 = puVar30;
                  pUVar22 = pUVar44;
                  if (uVar32 <= uVar27) goto LAB_002141d1;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                local_1d0 = puVar30;
                if ((bVar63) || (uVar32 = *puVar31, iVar69 = iVar28, uVar32 < uVar53)) break;
              } while( true );
            }
          }
          goto LAB_00213962;
        }
        uVar49 = 0;
        goto LAB_0021397d;
      }
      uVar21 = (ulong)local_1a0 & 0xffffffff;
      goto LAB_002142ee;
    }
    uVar21 = 0;
    local_1a0 = (ZSTD_optimal_t *)pUVar62;
LAB_002142ee:
    uVar60 = uVar21 & 0xffffffff;
    local_b0 = (ulong *)CONCAT44(local_b0._4_4_,pZVar59[uVar60].price);
    UVar14 = pZVar59[uVar60].off;
    uVar37 = pZVar59[uVar60].mlen;
    local_190 = (ZSTD_optimal_t *)(ulong)pZVar59[uVar60].litlen;
    local_c8 = pZVar59[uVar60].rep[2];
    local_d0 = *(undefined8 *)pZVar59[uVar60].rep;
    uVar27 = pZVar59[uVar60].litlen + uVar37;
    uVar13 = (uint)uVar21 - uVar27;
    if ((uint)uVar21 < uVar27) {
      uVar13 = 0;
    }
LAB_0021434c:
    uVar21 = (ulong)uVar13;
    if (uVar37 != 0) goto LAB_00214350;
    local_160 = pZVar59[uVar21].rep[2];
    local_168 = *(ulong *)pZVar59[uVar21].rep;
    uVar37 = 0;
  }
  uVar13 = (int)uVar21 + 1;
  pZVar59[uVar13].price = (int)local_b0;
  pZVar59[uVar13].off = UVar14;
  pZVar59[uVar13].mlen = uVar37;
  pZVar59[uVar13].litlen = (U32)local_190;
  *(undefined8 *)pZVar59[uVar13].rep = local_d0;
  pZVar59[uVar13].rep[2] = local_c8;
  uVar60 = uVar21;
  if ((int)uVar21 == 0) {
    uVar37 = 1;
    goto LAB_002144e8;
  }
  do {
    uVar27 = (uint)uVar21;
    uVar49 = pZVar59[uVar21].litlen + pZVar59[uVar21].mlen;
    uVar37 = (uint)uVar60;
    pZVar29 = pZVar59 + uVar21;
    iVar64 = pZVar29->price;
    UVar43 = pZVar29->off;
    UVar11 = pZVar29->mlen;
    UVar12 = pZVar29->litlen;
    pZVar29 = pZVar59 + uVar21;
    UVar15 = pZVar29->rep[0];
    UVar14 = pZVar29->rep[1];
    UVar17 = pZVar29->rep[2];
    pZVar10 = pZVar59 + uVar60;
    pZVar10->litlen = pZVar29->litlen;
    pZVar10->rep[0] = UVar15;
    pZVar10->rep[1] = UVar14;
    pZVar10->rep[2] = UVar17;
    pZVar29 = pZVar59 + uVar60;
    pZVar29->price = iVar64;
    pZVar29->off = UVar43;
    pZVar29->mlen = UVar11;
    pZVar29->litlen = UVar12;
    uVar60 = (ulong)(uVar37 - 1);
    uVar21 = (ulong)(uVar27 - uVar49);
    if (uVar49 > uVar27) {
      uVar21 = 0;
    }
  } while (uVar49 <= uVar27 && uVar27 - uVar49 != 0);
  for (; uVar37 <= uVar13; uVar37 = uVar37 + 1) {
LAB_002144e8:
    UVar15 = pZVar59[uVar37].mlen;
    uVar27 = pZVar59[uVar37].litlen;
    uVar21 = (ulong)uVar27;
    if (UVar15 == 0) {
      puVar40 = (ulong *)(uVar21 + (long)src);
    }
    else {
      UVar14 = pZVar59[uVar37].off;
      ZSTD_updateStats(poVar2,uVar27,(BYTE *)src,UVar14,UVar15);
      puVar45 = (ulong *)((long)src + uVar21);
      puVar40 = (ulong *)local_e8->lit;
      if (puVar19 < puVar45) {
        puVar33 = puVar40;
        puVar36 = (ulong *)src;
        if (src <= puVar19) {
          puVar33 = (ulong *)((long)puVar40 + ((long)puVar19 - (long)src));
          uVar60 = *(ulong *)((long)src + 8);
          *puVar40 = *src;
          puVar40[1] = uVar60;
          puVar36 = puVar19;
          if (0x10 < (long)puVar19 - (long)src) {
            lVar20 = 0x10;
            do {
              uVar9 = ((undefined8 *)((long)src + lVar20))[1];
              puVar4 = (undefined8 *)((long)puVar40 + lVar20);
              *puVar4 = *(undefined8 *)((long)src + lVar20);
              puVar4[1] = uVar9;
              puVar5 = (undefined8 *)((long)src + lVar20 + 0x10);
              uVar9 = puVar5[1];
              puVar4[2] = *puVar5;
              puVar4[3] = uVar9;
              lVar20 = lVar20 + 0x20;
            } while (puVar4 + 4 < puVar33);
          }
        }
        if (puVar36 < puVar45) {
          lVar20 = 0;
          do {
            *(undefined1 *)((long)puVar33 + lVar20) = *(undefined1 *)((long)puVar36 + lVar20);
            lVar20 = lVar20 + 1;
          } while ((long)puVar45 - (long)puVar36 != lVar20);
        }
LAB_0021464e:
        local_e8->lit = local_e8->lit + uVar21;
        psVar24 = local_e8->sequences;
        if (0xffff < uVar27) {
          local_e8->longLengthType = ZSTD_llt_literalLength;
          local_e8->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)local_e8->sequencesStart) >> 3);
        }
      }
      else {
        uVar60 = *(ulong *)((long)src + 8);
        *puVar40 = *src;
        puVar40[1] = uVar60;
        if (0x10 < uVar27) {
          pBVar61 = local_e8->lit;
          uVar60 = *(ulong *)((long)src + 0x18);
          *(ulong *)(pBVar61 + 0x10) = *(ulong *)((long)src + 0x10);
          *(ulong *)(pBVar61 + 0x18) = uVar60;
          if (0x10 < uVar21 - 0x10) {
            lVar20 = 0;
            do {
              puVar4 = (undefined8 *)((long)src + lVar20 + 0x20);
              uVar9 = puVar4[1];
              pBVar3 = pBVar61 + lVar20 + 0x20;
              *(undefined8 *)pBVar3 = *puVar4;
              *(undefined8 *)(pBVar3 + 8) = uVar9;
              puVar4 = (undefined8 *)((long)src + lVar20 + 0x30);
              uVar9 = puVar4[1];
              *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar3 + 0x18) = uVar9;
              lVar20 = lVar20 + 0x20;
            } while (pBVar3 + 0x20 < pBVar61 + uVar21);
            goto LAB_0021464e;
          }
        }
        local_e8->lit = local_e8->lit + uVar21;
        psVar24 = local_e8->sequences;
      }
      psVar24->litLength = (U16)uVar27;
      psVar24->offset = UVar14 + 1;
      if (0xffff < UVar15 - 3) {
        local_e8->longLengthType = ZSTD_llt_matchLength;
        local_e8->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)local_e8->sequencesStart) >> 3);
      }
      psVar24->matchLength = (U16)(UVar15 - 3);
      local_e8->sequences = psVar24 + 1;
      puVar40 = (ulong *)((long)src + (ulong)(UVar15 + uVar27));
      src = puVar40;
    }
  }
  ZSTD_setBasePrices(poVar2,2);
  puVar45 = local_e0;
  local_1b8 = (ulong *)src;
LAB_002146f5:
  src = local_1b8;
  if (local_130 <= puVar40) goto LAB_002149b7;
  goto LAB_00210db0;
LAB_002141d1:
  local_1d0 = &local_1a4;
  goto LAB_00213962;
LAB_002141de:
  local_230 = &local_1a4;
LAB_00213962:
  *local_1d0 = 0;
  *local_230 = 0;
  ms->nextToUpdate = iVar28 - 8;
LAB_0021397d:
  iVar28 = (int)pUVar23;
  local_10c = uVar49;
  ZSTD_optLdm_processMatchCandidate
            ((ZSTD_optLdm_t *)local_98,pZVar8,&local_10c,iVar68 - (int)local_e0,
             (int)puVar18 - iVar68);
  auVar67 = _DAT_00261a10;
  auVar72 = _DAT_0025e440;
  auVar65 = _DAT_0025e430;
  if ((ulong)local_10c != 0) {
    uVar37 = pZVar8[local_10c - 1].len;
    if (((uint)local_118 < uVar37) || (0xfff < uVar37 + iVar28)) {
      UVar15 = 0;
      if (pZVar29->mlen == 0) {
        UVar15 = pZVar29->litlen;
      }
      UVar14 = pZVar8[local_10c - 1].off;
      uVar13 = iVar28 - UVar15;
      if (0x1000 < iVar28 - UVar15) {
        uVar13 = 0;
      }
      goto LAB_0021434c;
    }
    uVar60 = 0;
    do {
      uVar13 = uVar26;
      if (uVar60 != 0) {
        uVar13 = pZVar8[uVar60 - 1].len + 1;
      }
      uVar37 = pZVar8[uVar60].len;
      if (uVar13 <= uVar37) {
        UVar14 = pZVar8[uVar60].off;
        uVar49 = UVar14 + 1;
        uVar27 = 0x1f;
        if (uVar49 != 0) {
          for (; uVar49 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        ZVar6 = (ms->opt).priceType;
        uVar49 = (int)pUVar23 + uVar37;
        do {
          if (ZVar6 == zop_predef) {
            uVar54 = uVar37 - 2;
            iVar28 = 0x1f;
            if (uVar54 != 0) {
              for (; uVar54 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            iVar28 = (uVar54 * 0x100 >> ((byte)iVar28 & 0x1f)) + (iVar28 + uVar27) * 0x100 + 0x1000;
          }
          else {
            uVar55 = uVar37 - 3;
            uVar54 = (ms->opt).offCodeFreq[uVar27] + 1;
            iVar28 = 0x1f;
            if (uVar54 != 0) {
              for (; uVar54 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            if (uVar55 < 0x80) {
              uVar55 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar55];
            }
            else {
              uVar38 = 0x1f;
              if (uVar55 != 0) {
                for (; uVar55 >> uVar38 == 0; uVar38 = uVar38 - 1) {
                }
              }
              uVar55 = (uVar38 ^ 0xffffffe0) + 0x44;
            }
            uVar38 = (ms->opt).matchLengthFreq[uVar55] + 1;
            iVar68 = 0x1f;
            if (uVar38 != 0) {
              for (; uVar38 >> iVar68 == 0; iVar68 = iVar68 + -1) {
              }
            }
            iVar28 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar54 * 0x100 >> ((byte)iVar28 & 0x1f)) +
                     (uVar38 * 0x100 >> ((byte)iVar68 & 0x1f)))) +
                     ((ML_bits[uVar55] + uVar27) - (iVar28 + iVar68)) * 0x100 + 0x33;
            pUVar23 = (U32 *)local_1a0;
          }
          iVar28 = iVar28 + UVar15 + iVar64;
          uVar54 = uVar37 + (int)pUVar23;
          if ((uint)uVar21 < uVar54) {
            uVar21 = uVar21 & 0xffffffff;
            lVar20 = ~uVar21 + (ulong)uVar49;
            auVar70._8_4_ = (int)lVar20;
            auVar70._0_8_ = lVar20;
            auVar70._12_4_ = (int)((ulong)lVar20 >> 0x20);
            pZVar29 = local_120 + uVar21;
            uVar51 = 0;
            do {
              auVar71._8_4_ = (int)uVar51;
              auVar71._0_8_ = uVar51;
              auVar71._12_4_ = (int)(uVar51 >> 0x20);
              auVar66 = (auVar71 | auVar65) ^ auVar72;
              iVar68 = SUB164(auVar70 ^ auVar72,0);
              bVar63 = iVar68 < auVar66._0_4_;
              iVar69 = SUB164(auVar70 ^ auVar72,4);
              iVar73 = auVar66._4_4_;
              if ((bool)(~(iVar69 < iVar73 || iVar73 == iVar69 && bVar63) & 1)) {
                pZVar29[-3].price = 0x40000000;
              }
              if (iVar69 >= iVar73 && (iVar73 != iVar69 || !bVar63)) {
                pZVar29[-2].price = 0x40000000;
              }
              auVar66 = (auVar71 | auVar67) ^ auVar72;
              iVar73 = auVar66._4_4_;
              if (iVar73 <= iVar69 && (iVar73 != iVar69 || auVar66._0_4_ <= iVar68)) {
                pZVar29[-1].price = 0x40000000;
                pZVar29->price = 0x40000000;
              }
              uVar51 = uVar51 + 4;
              pZVar29 = pZVar29 + 4;
            } while (((uVar49 - uVar21) + 3 & 0xfffffffffffffffc) != uVar51);
            uVar21 = (ulong)uVar49;
LAB_00213c73:
            pZVar59[uVar54].mlen = uVar37;
            pZVar59[uVar54].off = UVar14;
            pZVar59[uVar54].litlen = (U32)local_190;
            pZVar59[uVar54].price = iVar28;
          }
          else if (iVar28 < pZVar59[uVar54].price) goto LAB_00213c73;
          uVar37 = uVar37 - 1;
          uVar49 = uVar49 - 1;
        } while (uVar13 <= uVar37);
      }
      iVar28 = (int)pUVar23;
      uVar60 = uVar60 + 1;
    } while (uVar60 != local_10c);
  }
LAB_00213ccd:
  pUVar62 = (U32 *)(ulong)(iVar28 + 1U);
  if ((uint)uVar21 < iVar28 + 1U) goto LAB_002142ee;
  goto LAB_002125ca;
LAB_00215fbf:
  local_260 = &local_168;
  goto LAB_00215881;
LAB_00215fcc:
  local_250 = &local_168;
LAB_00215881:
  *(uint *)local_260 = 0;
  local_220 = local_250;
LAB_00215b51:
  *(uint *)local_220 = 0;
  ms->nextToUpdate = iVar28 - 8;
LAB_00216106:
  local_144 = uVar37;
  ZSTD_optLdm_processMatchCandidate
            ((ZSTD_optLdm_t *)local_98,pZVar8,&local_144,iVar64 - (int)local_e0,(int)puVar1 - iVar64
            );
  UVar15 = local_144;
  uVar21 = (ulong)local_144;
  if (uVar21 == 0) {
    puVar35 = (ulong *)((long)puVar35 + 1);
    goto LAB_002184dc;
  }
  lVar20 = 0;
  do {
    pZVar59->rep[lVar20] = *(U32 *)((long)local_128 + lVar20 * 4);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  pZVar59->mlen = 0;
  pZVar59->litlen = (U32)local_190;
  UVar14 = ZSTD_litLengthPrice((U32)local_190,poVar2,2);
  pZVar59->price = UVar14;
  uVar13 = pZVar8[UVar15 - 1].len;
  if ((uint)local_f0 < uVar13) {
    UVar14 = pZVar8[UVar15 - 1].off;
    uVar21 = 0;
LAB_00218177:
    pUVar62 = pZVar59[uVar21].rep;
    if (UVar14 < 3) {
      uVar37 = ((int)local_190 == 0) + UVar14;
      if (uVar37 == 0) {
        uVar60 = *(ulong *)pUVar62;
        uVar51 = uVar60 >> 0x20;
        pUVar62 = pZVar59[uVar21].rep + 2;
      }
      else {
        if (uVar37 == 3) {
          uVar49 = *pUVar62;
          uVar27 = uVar49 - 1;
        }
        else {
          uVar27 = pUVar62[uVar37];
          uVar49 = *pUVar62;
        }
        uVar60 = (ulong)uVar27;
        uVar51 = (ulong)uVar49;
        pUVar62 = pUVar62 + (ulong)(uVar37 == 1) + 1;
      }
    }
    else {
      uVar51 = (ulong)*pUVar62;
      pUVar62 = pZVar59[uVar21].rep + 1;
      uVar60 = (ulong)(UVar14 - 2);
    }
    UVar15 = *pUVar62;
    *local_128 = uVar60 & 0xffffffff | uVar51 << 0x20;
    *(U32 *)(local_128 + 1) = UVar15;
  }
  else {
    UVar15 = ZSTD_litLengthPrice(0,poVar2,2);
    auVar65 = _DAT_0025e440;
    lVar20 = 0;
    pZVar29 = local_d8;
    do {
      auVar67._8_4_ = (int)lVar20;
      auVar67._0_8_ = lVar20;
      auVar67._12_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar72 = (auVar67 | _DAT_0025e430) ^ auVar65;
      bVar63 = (int)local_58._0_4_ < auVar72._0_4_;
      iVar64 = auVar72._4_4_;
      if ((bool)(~((int)local_58._4_4_ < iVar64 || iVar64 == local_58._4_4_ && bVar63) & 1)) {
        pZVar29[-3].price = 0x40000000;
      }
      if ((int)local_58._4_4_ >= iVar64 && (iVar64 != local_58._4_4_ || !bVar63)) {
        pZVar29[-2].price = 0x40000000;
      }
      auVar72 = (auVar67 | _DAT_00261a10) ^ auVar65;
      iVar64 = auVar72._4_4_;
      if (iVar64 <= (int)local_58._4_4_ &&
          (iVar64 != local_58._4_4_ || auVar72._0_4_ <= (int)local_58._0_4_)) {
        pZVar29[-1].price = 0x40000000;
        pZVar29->price = 0x40000000;
      }
      lVar20 = lVar20 + 4;
      pZVar29 = pZVar29 + 4;
    } while (local_48._0_8_ != lVar20);
    uVar51 = 0;
    uVar60 = (ulong)uVar26;
    do {
      uVar13 = pZVar8[uVar51].len;
      if ((uint)uVar60 <= uVar13) {
        UVar17 = pZVar8[uVar51].off;
        uVar27 = UVar17 + 1;
        uVar37 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar37 == 0; uVar37 = uVar37 - 1) {
          }
        }
        ZVar6 = (ms->opt).priceType;
        uVar27 = (uint)uVar60 * 0x100 - 0x200;
        do {
          UVar43 = (U32)uVar60;
          if (ZVar6 == zop_predef) {
            iVar64 = 0x1f;
            if (UVar43 - 2 != 0) {
              for (; UVar43 - 2 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            iVar64 = (iVar64 + uVar37) * 0x100 + (uVar27 >> ((byte)iVar64 & 0x1f)) + 0x1000;
          }
          else {
            uVar54 = UVar43 - 3;
            uVar49 = (ms->opt).offCodeFreq[uVar37] + 1;
            iVar64 = 0x1f;
            if (uVar49 != 0) {
              for (; uVar49 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            if (uVar54 < 0x80) {
              uVar54 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar54];
            }
            else {
              uVar55 = 0x1f;
              if (uVar54 != 0) {
                for (; uVar54 >> uVar55 == 0; uVar55 = uVar55 - 1) {
                }
              }
              uVar54 = (uVar55 ^ 0xffffffe0) + 0x44;
            }
            uVar55 = (ms->opt).matchLengthFreq[uVar54] + 1;
            iVar28 = 0x1f;
            if (uVar55 != 0) {
              for (; uVar55 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            iVar64 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar49 * 0x100 >> ((byte)iVar64 & 0x1f)) +
                     (uVar55 * 0x100 >> ((byte)iVar28 & 0x1f)))) +
                     ((ML_bits[uVar54] + uVar37) - (iVar64 + iVar28)) * 0x100 + 0x33;
            pZVar59 = local_120;
          }
          pZVar59[uVar60].mlen = UVar43;
          pZVar59[uVar60].off = UVar17;
          pZVar59[uVar60].litlen = (U32)local_190;
          pZVar59[uVar60].price = iVar64 + UVar15 + UVar14;
          uVar60 = (ulong)(UVar43 + 1);
          uVar27 = uVar27 + 0x100;
        } while (UVar43 + 1 <= uVar13);
      }
      uVar51 = uVar51 + 1;
    } while (uVar51 != uVar21);
    uVar13 = (int)uVar60 - 1;
    uVar21 = (ulong)uVar13;
    if (uVar13 != 0) {
      local_a8 = (ulong *)((long)puVar35 + 0xc);
      local_b0 = puVar35 + 1;
      local_c0 = (long)puVar35 + 0xb;
      uVar60 = 1;
LAB_00216456:
      uVar51 = uVar60;
      iVar64 = (int)uVar51;
      pZVar29 = pZVar59 + (iVar64 - 1U);
      UVar15 = 1;
      if (pZVar59[iVar64 - 1U].mlen == 0) {
        UVar15 = pZVar29->litlen + 1;
      }
      puVar45 = (ulong *)((long)puVar35 + uVar51);
      iVar28 = 0x800;
      if (((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) &&
         (iVar28 = 0x600, (ms->opt).priceType != zop_predef)) {
        uVar13 = (ms->opt).litFreq[*(byte *)((long)puVar45 + -1)] + 1;
        iVar28 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar28 == 0; iVar28 = iVar28 + -1) {
          }
        }
        iVar28 = (ms->opt).litSumBasePrice -
                 (iVar28 * 0x100 + (uVar13 * 0x100 >> ((byte)iVar28 & 0x1f)));
      }
      local_190 = (ZSTD_optimal_t *)CONCAT44(local_190._4_4_,pZVar29->price);
      UVar14 = ZSTD_litLengthPrice(UVar15,poVar2,2);
      iVar68 = UVar14 + iVar28 + (int)local_190;
      UVar14 = ZSTD_litLengthPrice(UVar15 - 1,poVar2,2);
      iVar68 = iVar68 - UVar14;
      pZVar10 = pZVar59 + uVar51;
      iVar28 = pZVar59[uVar51].price;
      if (iVar28 < iVar68) {
        iVar68 = iVar28;
        if (pZVar10->mlen == 0) goto LAB_002165c9;
        uVar37 = iVar64 - pZVar10->mlen;
        pUVar62 = pZVar59[uVar37].rep;
        uVar13 = pZVar10->off;
        if (uVar13 < 3) {
          uVar13 = uVar13 + (pZVar10->litlen == 0);
          if (uVar13 == 0) {
            uVar60 = *(ulong *)pUVar62;
            uVar50 = uVar60 >> 0x20;
            pUVar62 = pZVar59[uVar37].rep + 2;
          }
          else {
            if (uVar13 == 3) {
              uVar27 = *pUVar62;
              uVar37 = uVar27 - 1;
            }
            else {
              uVar37 = pUVar62[uVar13];
              uVar27 = *pUVar62;
            }
            uVar60 = (ulong)uVar37;
            uVar50 = (ulong)uVar27;
            pUVar62 = pUVar62 + (ulong)(uVar13 == 1) + 1;
          }
        }
        else {
          uVar50 = (ulong)*pUVar62;
          pUVar62 = pZVar59[uVar37].rep + 1;
          uVar60 = (ulong)(uVar13 - 2);
        }
        UVar15 = *pUVar62;
        *(ulong *)pZVar10->rep = uVar60 & 0xffffffff | uVar50 << 0x20;
        pZVar10->rep[2] = UVar15;
        uVar13 = 1;
        bVar63 = false;
      }
      else {
        pZVar10->off = 0;
        pZVar10->mlen = 0;
        pZVar10->litlen = UVar15;
        pZVar10->price = iVar68;
LAB_002165c9:
        pZVar10->rep[2] = pZVar29->rep[2];
        *(undefined8 *)pZVar10->rep = *(undefined8 *)pZVar29->rep;
        bVar63 = true;
        uVar13 = 0;
      }
      if (puVar40 < puVar45) goto LAB_00217e61;
      if (iVar64 != (int)uVar21) {
        local_198 = (uint *)CONCAT44(local_198._4_4_,iVar68);
        local_190 = (ZSTD_optimal_t *)0x0;
        if (bVar63) {
          local_190 = (ZSTD_optimal_t *)(ulong)pZVar10->litlen;
        }
        local_100 = &pZVar10->mlen;
        UVar15 = ZSTD_litLengthPrice(0,poVar2,2);
        pBVar61 = (ms->window).base;
        uVar37 = ms->nextToUpdate;
        uVar60 = (ulong)uVar37;
        iVar28 = (int)puVar45;
        if (pBVar61 + uVar60 <= puVar45) {
          UVar14 = (ms->cParams).minMatch;
          uVar27 = iVar28 - (int)pBVar61;
          pZVar59 = local_120;
          while (local_120 = pZVar59, uVar37 < uVar27) {
            UVar17 = ZSTD_insertBt1(ms,pBVar61 + uVar60,(BYTE *)puVar1,UVar14,0);
            uVar37 = (int)uVar60 + UVar17;
            uVar60 = (ulong)uVar37;
            pZVar59 = local_120;
          }
          local_138 = (long)local_b0 + uVar51;
          ms->nextToUpdate = uVar27;
          local_150._4_4_ = (undefined4)((ulong)local_150 >> 0x20);
          local_178._4_4_ = (undefined4)((ulong)local_178 >> 0x20);
          local_180._4_4_ = (undefined4)((ulong)local_180 >> 0x20);
          local_f8._4_4_ = (undefined4)((ulong)local_f8 >> 0x20);
          if (UVar14 - 6 < 2) {
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            local_188 = (U32 *)(ms->window).base;
            uVar55 = iVar28 - (int)local_188;
            local_158 = (ulong *)(*puVar45 * -0x30e4432340650000 >>
                                 (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar49 = uVar55 - uVar54;
            uVar27 = 0;
            if (uVar55 < uVar54) {
              uVar49 = 0;
            }
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar49);
            UVar14 = (ms->window).lowLimit;
            uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = uVar55 - uVar38;
            if (uVar55 - UVar14 <= uVar38) {
              UVar17 = UVar14;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar17 = UVar14;
            }
            uVar32 = UVar17 + (UVar17 == 0);
            local_178 = (ulong *)CONCAT44(local_178._4_4_,uVar32);
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar54);
            uVar52 = (ulong)((uVar54 & uVar55) * 2);
            local_1c0 = (ulong *)(local_118 + uVar52);
            UVar14 = (ms->window).dictLimit;
            uVar50 = (ulong)uVar13;
            local_140 = ms->hashTable;
            uVar39 = local_140[(long)local_158];
            iVar68 = uVar55 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar38);
            uVar60 = uVar50 + 3;
            puVar36 = (ulong *)((long)puVar45 + 4);
            uVar56 = (ulong)local_108;
            do {
              if (uVar50 == 3) {
                UVar43 = pZVar10->rep[0] - 1;
              }
              else {
                UVar43 = pZVar10->rep[uVar50];
              }
              uVar47 = 0;
              if (((UVar43 - 1 < uVar55 - UVar14) && (UVar17 <= uVar55 - UVar43)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)UVar43))) {
                lVar20 = -(ulong)UVar43;
                puVar25 = (ulong *)((long)puVar36 + lVar20);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = lVar20 + uVar51;
                    lVar58 = 0;
                    do {
                      puVar57 = (ulong *)((long)local_a8 + lVar58 + uVar51);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_a8 + lVar58 + lVar20);
                        goto LAB_00216d69;
                      }
                      uVar47 = *(ulong *)((long)local_a8 + lVar58 + lVar20);
                      lVar58 = lVar58 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar53 = ((uint)(uVar46 >> 3) & 0x1fffffff) + (int)lVar58;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar53 = (uint)(uVar47 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00216d69:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar53 = (int)puVar57 - (int)puVar36;
                }
                uVar47 = (ulong)(uVar53 + 4);
              }
              if (uVar56 < uVar47) {
                pZVar8[uVar27].off = (int)uVar50 - uVar13;
                pZVar8[uVar27].len = (uint)uVar47;
                uVar27 = uVar27 + 1;
                if ((uVar37 < (uint)uVar47) ||
                   (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1))
                goto LAB_00217c40;
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 < uVar60);
            local_140[(long)local_158] = uVar55;
            puVar36 = (ulong *)(local_118 + uVar52 + 1);
            if (uVar32 <= uVar39) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              uVar51 = 0;
              uVar60 = 0;
              local_1f8 = (ulong *)(local_118 + uVar52 + 1);
              iVar69 = iVar68;
              do {
                uVar52 = (ulong)uVar39;
                uVar50 = uVar60;
                if (uVar51 < uVar60) {
                  uVar50 = uVar51;
                }
                puVar36 = (ulong *)((long)puVar45 + uVar50);
                puVar25 = (ulong *)((long)local_188 + uVar50 + uVar52);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = 0;
                    do {
                      puVar57 = (ulong *)(local_138 + uVar50 + lVar20);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_188 + uVar52 + uVar50 + lVar20 + 8);
                        goto LAB_00216f34;
                      }
                      uVar47 = *(ulong *)((long)local_188 + lVar20 + uVar52 + uVar50 + 8);
                      lVar20 = lVar20 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar47 = (uVar46 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar47 = uVar47 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00216f34:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar47 = (long)puVar57 - (long)puVar36;
                }
                uVar47 = uVar47 + uVar50;
                iVar68 = iVar69;
                puVar36 = local_1f8;
                if (uVar56 < uVar47) {
                  iVar68 = uVar39 + (U32)uVar47;
                  if (uVar47 <= iVar69 - uVar39) {
                    iVar68 = iVar69;
                  }
                  pZVar8[uVar27].off = (uVar55 + 2) - uVar39;
                  pZVar8[uVar27].len = (U32)uVar47;
                  uVar27 = uVar27 + 1;
                  if ((0x1000 < uVar47) ||
                     (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1)) break;
                }
                puVar36 = (ulong *)(local_118 + (uVar39 & uVar54) * 2);
                if (*(byte *)((long)local_188 + uVar47 + uVar52) < *(byte *)((long)puVar45 + uVar47)
                   ) {
                  *(uint *)local_1c0 = uVar39;
                  if (uVar39 <= uVar49) goto LAB_00217b05;
                  local_1c0 = (ulong *)((long)puVar36 + 4);
                  puVar36 = local_1f8;
                  puVar25 = local_1c0;
                  uVar51 = uVar47;
                }
                else {
                  *(uint *)local_1f8 = uVar39;
                  puVar25 = puVar36;
                  uVar60 = uVar47;
                  if (uVar39 <= uVar49) goto LAB_00217af8;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if ((bVar63) ||
                   (uVar39 = (uint)*puVar25, local_1f8 = puVar36, iVar69 = iVar68, uVar39 < uVar32))
                break;
              } while( true );
            }
          }
          else if (UVar14 == 5) {
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            local_188 = (U32 *)(ms->window).base;
            uVar55 = iVar28 - (int)local_188;
            local_158 = (ulong *)(*puVar45 * -0x30e4432345000000 >>
                                 (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar49 = uVar55 - uVar54;
            uVar27 = 0;
            if (uVar55 < uVar54) {
              uVar49 = 0;
            }
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar49);
            UVar14 = (ms->window).lowLimit;
            uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = uVar55 - uVar38;
            if (uVar55 - UVar14 <= uVar38) {
              UVar17 = UVar14;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar17 = UVar14;
            }
            uVar32 = UVar17 + (UVar17 == 0);
            local_178 = (ulong *)CONCAT44(local_178._4_4_,uVar32);
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar54);
            uVar52 = (ulong)((uVar54 & uVar55) * 2);
            local_1c0 = (ulong *)(local_118 + uVar52);
            UVar14 = (ms->window).dictLimit;
            uVar50 = (ulong)uVar13;
            local_140 = ms->hashTable;
            uVar39 = local_140[(long)local_158];
            iVar68 = uVar55 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar38);
            uVar60 = uVar50 + 3;
            puVar36 = (ulong *)((long)puVar45 + 4);
            uVar56 = (ulong)local_108;
            do {
              if (uVar50 == 3) {
                uVar53 = pZVar10->rep[0] - 1;
              }
              else {
                uVar53 = pZVar10->rep[uVar50];
              }
              uVar47 = 0;
              if (((uVar53 - 1 < uVar55 - UVar14) && (UVar17 <= uVar55 - uVar53)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar53))) {
                lVar20 = -(ulong)uVar53;
                puVar25 = (ulong *)((long)puVar36 + lVar20);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = lVar20 + uVar51;
                    lVar58 = 0;
                    do {
                      puVar57 = (ulong *)((long)local_a8 + lVar58 + uVar51);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_a8 + lVar58 + lVar20);
                        goto LAB_00217296;
                      }
                      uVar47 = *(ulong *)((long)local_a8 + lVar58 + lVar20);
                      lVar58 = lVar58 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar53 = ((uint)(uVar46 >> 3) & 0x1fffffff) + (int)lVar58;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar53 = (uint)(uVar47 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00217296:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar53 = (int)puVar57 - (int)puVar36;
                }
                uVar47 = (ulong)(uVar53 + 4);
              }
              if (uVar56 < uVar47) {
                pZVar8[uVar27].off = (int)uVar50 - uVar13;
                pZVar8[uVar27].len = (uint)uVar47;
                uVar27 = uVar27 + 1;
                if ((uVar37 < (uint)uVar47) ||
                   (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1))
                goto LAB_00217c40;
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 < uVar60);
            local_140[(long)local_158] = uVar55;
            puVar36 = (ulong *)(local_118 + uVar52 + 1);
            if (uVar32 <= uVar39) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              uVar51 = 0;
              uVar60 = 0;
              local_1f8 = (ulong *)(local_118 + uVar52 + 1);
              iVar69 = iVar68;
              do {
                uVar52 = (ulong)uVar39;
                uVar50 = uVar60;
                if (uVar51 < uVar60) {
                  uVar50 = uVar51;
                }
                puVar36 = (ulong *)((long)puVar45 + uVar50);
                puVar25 = (ulong *)((long)local_188 + uVar50 + uVar52);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = 0;
                    do {
                      puVar57 = (ulong *)(local_138 + uVar50 + lVar20);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_188 + uVar52 + uVar50 + lVar20 + 8);
                        goto LAB_00217458;
                      }
                      uVar47 = *(ulong *)((long)local_188 + lVar20 + uVar52 + uVar50 + 8);
                      lVar20 = lVar20 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar47 = (uVar46 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar47 = uVar47 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00217458:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar47 = (long)puVar57 - (long)puVar36;
                }
                uVar47 = uVar47 + uVar50;
                iVar68 = iVar69;
                puVar36 = local_1f8;
                if (uVar56 < uVar47) {
                  iVar68 = uVar39 + (U32)uVar47;
                  if (uVar47 <= iVar69 - uVar39) {
                    iVar68 = iVar69;
                  }
                  pZVar8[uVar27].off = (uVar55 + 2) - uVar39;
                  pZVar8[uVar27].len = (U32)uVar47;
                  uVar27 = uVar27 + 1;
                  if ((0x1000 < uVar47) ||
                     (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1)) break;
                }
                puVar36 = (ulong *)(local_118 + (uVar39 & uVar54) * 2);
                if (*(byte *)((long)local_188 + uVar47 + uVar52) < *(byte *)((long)puVar45 + uVar47)
                   ) {
                  *(uint *)local_1c0 = uVar39;
                  if (uVar39 <= uVar49) goto LAB_00217b05;
                  local_1c0 = (ulong *)((long)puVar36 + 4);
                  puVar36 = local_1f8;
                  puVar25 = local_1c0;
                  uVar51 = uVar47;
                }
                else {
                  *(uint *)local_1f8 = uVar39;
                  puVar25 = puVar36;
                  uVar60 = uVar47;
                  if (uVar39 <= uVar49) goto LAB_00217af8;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if ((bVar63) ||
                   (uVar39 = (uint)*puVar25, local_1f8 = puVar36, iVar69 = iVar68, uVar39 < uVar32))
                break;
              } while( true );
            }
          }
          else {
            if (UVar14 == 3) {
              uVar37 = (ms->cParams).targetLength;
              if (0xffe < uVar37) {
                uVar37 = 0xfff;
              }
              local_180 = (ms->window).base;
              uVar49 = iVar28 - (int)local_180;
              local_140 = (U32 *)(ulong)((uint)*puVar45 * -0x61c8864f >>
                                        (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar68 = uVar49 - uVar54;
              uVar27 = 0;
              if (uVar49 < uVar54) {
                iVar68 = 0;
              }
              local_118._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
              local_118 = (U32 *)CONCAT44(local_118._4_4_,iVar68);
              uVar55 = (ms->window).lowLimit;
              uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar38 = uVar49 - uVar39;
              if (uVar49 - uVar55 <= uVar39) {
                uVar38 = uVar55;
              }
              local_188 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar38 = uVar55;
              }
              uVar55 = uVar38 + (uVar38 == 0);
              local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar54);
              uVar60 = (ulong)((uVar54 & uVar49) * 2);
              local_178 = (ulong *)(local_188 + uVar60);
              local_158 = (ulong *)(local_188 + uVar60 + 1);
              UVar14 = (ms->window).dictLimit;
              uVar50 = (ulong)uVar13;
              local_f8 = ms->hashTable;
              uVar54 = local_f8[(long)local_140];
              iVar68 = uVar49 + 9;
              local_9c = (ms->cParams).searchLog;
              uVar60 = uVar50 + 3;
              puVar36 = (ulong *)((long)puVar45 + 3);
              uVar56 = (ulong)local_108;
              do {
                if (uVar50 == 3) {
                  UVar17 = pZVar10->rep[0] - 1;
                }
                else {
                  UVar17 = pZVar10->rep[uVar50];
                }
                uVar52 = 0;
                if (((UVar17 - 1 < uVar49 - UVar14) && (uVar52 = 0, uVar38 <= uVar49 - UVar17)) &&
                   (uVar52 = 0,
                   ((*(uint *)((long)puVar45 - (ulong)UVar17) ^ (uint)*puVar45) & 0xffffff) == 0)) {
                  lVar20 = -(ulong)UVar17;
                  puVar25 = (ulong *)((long)puVar36 + lVar20);
                  puVar57 = puVar36;
                  if (puVar36 < puVar18) {
                    if (*puVar25 == *puVar36) {
                      lVar20 = lVar20 + uVar51 + local_c0;
                      lVar58 = 0;
                      do {
                        puVar57 = (ulong *)(uVar51 + local_c0 + lVar58);
                        if (puVar18 <= puVar57) {
                          puVar25 = (ulong *)(lVar20 + lVar58);
                          goto LAB_002169b6;
                        }
                        uVar52 = *(ulong *)(lVar20 + lVar58);
                        lVar58 = lVar58 + 8;
                      } while (uVar52 == *puVar57);
                      uVar52 = *puVar57 ^ uVar52;
                      uVar47 = 0;
                      if (uVar52 != 0) {
                        for (; (uVar52 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar39 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar58;
                    }
                    else {
                      uVar47 = *puVar36 ^ *puVar25;
                      uVar52 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar39 = (uint)(uVar52 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_002169b6:
                    if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                      puVar57 = (ulong *)((long)puVar57 + 4);
                      puVar25 = (ulong *)((long)puVar25 + 4);
                    }
                    if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                      puVar57 = (ulong *)((long)puVar57 + 2);
                      puVar25 = (ulong *)((long)puVar25 + 2);
                    }
                    if (puVar57 < puVar1) {
                      puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57))
                      ;
                    }
                    uVar39 = (int)puVar57 - (int)puVar36;
                  }
                  uVar52 = (ulong)(uVar39 + 3);
                }
                if (uVar56 < uVar52) {
                  pZVar8[uVar27].off = (int)uVar50 - uVar13;
                  pZVar8[uVar27].len = (uint)uVar52;
                  uVar27 = uVar27 + 1;
                  if ((uVar37 < (uint)uVar52) ||
                     (uVar56 = uVar52, (ulong *)((long)puVar45 + uVar52) == puVar1))
                  goto LAB_00217c40;
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 < uVar60);
              if (((uVar56 < 3) &&
                  (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_1a4,(BYTE *)puVar45),
                  uVar55 <= UVar14)) && (uVar49 - UVar14 < 0x40000)) {
                uVar60 = (ulong)UVar14;
                puVar36 = (ulong *)(local_180 + uVar60);
                puVar25 = puVar45;
                if (puVar45 < puVar18) {
                  if (*puVar36 == *puVar45) {
                    lVar20 = 0;
                    do {
                      puVar25 = (ulong *)(local_138 + lVar20);
                      if (puVar18 <= puVar25) {
                        puVar36 = (ulong *)(local_180 + lVar20 + uVar60 + 8);
                        goto LAB_00217b70;
                      }
                      lVar58 = lVar20 + uVar60 + 8;
                      lVar20 = lVar20 + 8;
                    } while (*(ulong *)(local_180 + lVar58) == *puVar25);
                    uVar51 = *puVar25 ^ *(ulong *)(local_180 + lVar58);
                    uVar60 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                      }
                    }
                    uVar60 = (uVar60 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar51 = *puVar45 ^ *puVar36;
                    uVar60 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                      }
                    }
                    uVar60 = uVar60 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00217b70:
                  if ((puVar25 < puVar19) && ((uint)*puVar36 == (uint)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar25 < puVar33) && ((short)*puVar36 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar25 < puVar1) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar25));
                  }
                  uVar60 = (long)puVar25 - (long)puVar45;
                }
                if (uVar60 < 3) goto LAB_00217bf5;
                pZVar8->off = (uVar49 - UVar14) + 2;
                pZVar8->len = (U32)uVar60;
                if ((uVar60 <= uVar37) &&
                   (uVar27 = 1, uVar56 = uVar60, (ulong *)((long)puVar45 + uVar60) != puVar1))
                goto LAB_00217bf5;
                UVar14 = uVar49 + 1;
                uVar27 = 1;
              }
              else {
LAB_00217bf5:
                local_f8[(long)local_140] = uVar49;
                puVar36 = local_158;
                if (uVar55 <= uVar54) {
                  uVar13 = ~(-1 << ((byte)local_9c & 0x1f));
                  uVar51 = 0;
                  uVar60 = 0;
                  do {
                    uVar50 = uVar60;
                    if (uVar51 < uVar60) {
                      uVar50 = uVar51;
                    }
                    uVar52 = (ulong)uVar54;
                    puVar25 = (ulong *)((long)puVar45 + uVar50);
                    puVar57 = (ulong *)(local_180 + uVar50 + uVar52);
                    puVar48 = puVar25;
                    if (puVar25 < puVar18) {
                      if (*puVar57 == *puVar25) {
                        lVar20 = 0;
                        do {
                          puVar48 = (ulong *)(local_138 + uVar50 + lVar20);
                          local_158 = puVar36;
                          if (puVar18 <= puVar48) {
                            puVar57 = (ulong *)(local_180 + uVar52 + uVar50 + lVar20 + 8);
                            goto LAB_00217f71;
                          }
                          lVar58 = lVar20 + uVar52 + uVar50 + 8;
                          lVar20 = lVar20 + 8;
                        } while (*(ulong *)(local_180 + lVar58) == *puVar48);
                        uVar46 = *puVar48 ^ *(ulong *)(local_180 + lVar58);
                        uVar47 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                          }
                        }
                        uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar20;
                      }
                      else {
                        uVar46 = *puVar25 ^ *puVar57;
                        uVar47 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                          }
                        }
                        uVar47 = uVar47 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00217f71:
                      if ((puVar48 < puVar19) && ((uint)*puVar57 == (uint)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 4);
                        puVar57 = (ulong *)((long)puVar57 + 4);
                      }
                      if ((puVar48 < puVar33) && ((short)*puVar57 == (short)*puVar48)) {
                        puVar48 = (ulong *)((long)puVar48 + 2);
                        puVar57 = (ulong *)((long)puVar57 + 2);
                      }
                      if (puVar48 < puVar1) {
                        puVar48 = (ulong *)((long)puVar48 +
                                           (ulong)((BYTE)*puVar57 == (BYTE)*puVar48));
                      }
                      uVar47 = (long)puVar48 - (long)puVar25;
                    }
                    uVar47 = uVar47 + uVar50;
                    if (uVar56 < uVar47) {
                      iVar69 = uVar54 + (U32)uVar47;
                      if (uVar47 <= iVar68 - uVar54) {
                        iVar69 = iVar68;
                      }
                      iVar68 = iVar69;
                      pZVar8[uVar27].off = (uVar49 + 2) - uVar54;
                      pZVar8[uVar27].len = (U32)uVar47;
                      uVar27 = uVar27 + 1;
                      if ((0x1000 < uVar47) ||
                         (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1)) break;
                    }
                    puVar25 = (ulong *)(local_188 + (uVar54 & (uint)local_150) * 2);
                    if (local_180[uVar47 + uVar52] < *(byte *)((long)puVar45 + uVar47)) {
                      *(uint *)local_178 = uVar54;
                      if (uVar54 <= (uint)local_118) {
                        local_178 = &local_168;
                        break;
                      }
                      puVar25 = (ulong *)((long)puVar25 + 4);
                      uVar51 = uVar47;
                      local_178 = puVar25;
                    }
                    else {
                      *(uint *)puVar36 = uVar54;
                      uVar60 = uVar47;
                      puVar36 = puVar25;
                      if (uVar54 <= (uint)local_118) {
                        puVar36 = &local_168;
                        break;
                      }
                    }
                    bVar63 = uVar13 == 0;
                    uVar13 = uVar13 - 1;
                    if ((bVar63) || (uVar54 = (uint)*puVar25, uVar54 < uVar55)) break;
                  } while( true );
                }
                *(uint *)puVar36 = 0;
                *(uint *)local_178 = 0;
                UVar14 = iVar68 - 8;
              }
              ms->nextToUpdate = UVar14;
              goto LAB_00217c40;
            }
            uVar37 = (ms->cParams).targetLength;
            if (0xffe < uVar37) {
              uVar37 = 0xfff;
            }
            local_188 = (U32 *)(ms->window).base;
            uVar55 = iVar28 - (int)local_188;
            local_158 = (ulong *)(ulong)((uint)*puVar45 * -0x61c8864f >>
                                        (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar49 = uVar55 - uVar54;
            uVar27 = 0;
            if (uVar55 < uVar54) {
              uVar49 = 0;
            }
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar49);
            UVar14 = (ms->window).lowLimit;
            uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = uVar55 - uVar38;
            if (uVar55 - UVar14 <= uVar38) {
              UVar17 = UVar14;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar17 = UVar14;
            }
            uVar32 = UVar17 + (UVar17 == 0);
            local_178 = (ulong *)CONCAT44(local_178._4_4_,uVar32);
            local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar54);
            uVar52 = (ulong)((uVar54 & uVar55) * 2);
            local_1c0 = (ulong *)(local_118 + uVar52);
            UVar14 = (ms->window).dictLimit;
            uVar50 = (ulong)uVar13;
            local_140 = ms->hashTable;
            uVar39 = local_140[(long)local_158];
            iVar68 = uVar55 + 9;
            uVar38 = (ms->cParams).searchLog;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar38);
            uVar60 = uVar50 + 3;
            puVar36 = (ulong *)((long)puVar45 + 4);
            uVar56 = (ulong)local_108;
            do {
              if (uVar50 == 3) {
                uVar53 = pZVar10->rep[0] - 1;
              }
              else {
                uVar53 = pZVar10->rep[uVar50];
              }
              uVar47 = 0;
              if (((uVar53 - 1 < uVar55 - UVar14) && (UVar17 <= uVar55 - uVar53)) &&
                 ((uint)*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar53))) {
                lVar20 = -(ulong)uVar53;
                puVar25 = (ulong *)((long)puVar36 + lVar20);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = lVar20 + uVar51;
                    lVar58 = 0;
                    do {
                      puVar57 = (ulong *)((long)local_a8 + lVar58 + uVar51);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_a8 + lVar58 + lVar20);
                        goto LAB_002177b0;
                      }
                      uVar47 = *(ulong *)((long)local_a8 + lVar58 + lVar20);
                      lVar58 = lVar58 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar53 = ((uint)(uVar46 >> 3) & 0x1fffffff) + (int)lVar58;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar53 = (uint)(uVar47 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_002177b0:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar53 = (int)puVar57 - (int)puVar36;
                }
                uVar47 = (ulong)(uVar53 + 4);
              }
              if (uVar56 < uVar47) {
                pZVar8[uVar27].off = (int)uVar50 - uVar13;
                pZVar8[uVar27].len = (uint)uVar47;
                uVar27 = uVar27 + 1;
                if ((uVar37 < (uint)uVar47) ||
                   (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1))
                goto LAB_00217c40;
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 < uVar60);
            local_140[(long)local_158] = uVar55;
            puVar36 = (ulong *)(local_118 + uVar52 + 1);
            if (uVar32 <= uVar39) {
              uVar13 = ~(-1 << ((byte)uVar38 & 0x1f));
              uVar51 = 0;
              uVar60 = 0;
              local_1f8 = (ulong *)(local_118 + uVar52 + 1);
              iVar69 = iVar68;
              do {
                uVar52 = (ulong)uVar39;
                uVar50 = uVar60;
                if (uVar51 < uVar60) {
                  uVar50 = uVar51;
                }
                puVar36 = (ulong *)((long)puVar45 + uVar50);
                puVar25 = (ulong *)((long)local_188 + uVar50 + uVar52);
                puVar57 = puVar36;
                if (puVar36 < puVar18) {
                  if (*puVar25 == *puVar36) {
                    lVar20 = 0;
                    do {
                      puVar57 = (ulong *)(local_138 + uVar50 + lVar20);
                      if (puVar18 <= puVar57) {
                        puVar25 = (ulong *)((long)local_188 + uVar52 + uVar50 + lVar20 + 8);
                        goto LAB_002179ab;
                      }
                      uVar47 = *(ulong *)((long)local_188 + lVar20 + uVar52 + uVar50 + 8);
                      lVar20 = lVar20 + 8;
                    } while (uVar47 == *puVar57);
                    uVar47 = *puVar57 ^ uVar47;
                    uVar46 = 0;
                    if (uVar47 != 0) {
                      for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar47 = (uVar46 >> 3 & 0x1fffffff) + lVar20;
                  }
                  else {
                    uVar46 = *puVar36 ^ *puVar25;
                    uVar47 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    uVar47 = uVar47 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_002179ab:
                  if ((puVar57 < puVar19) && ((uint)*puVar25 == (uint)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar57 < puVar33) && ((short)*puVar25 == (short)*puVar57)) {
                    puVar57 = (ulong *)((long)puVar57 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar57 < puVar1) {
                    puVar57 = (ulong *)((long)puVar57 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar57));
                  }
                  uVar47 = (long)puVar57 - (long)puVar36;
                }
                uVar47 = uVar47 + uVar50;
                iVar68 = iVar69;
                puVar36 = local_1f8;
                if (uVar56 < uVar47) {
                  iVar68 = uVar39 + (U32)uVar47;
                  if (uVar47 <= iVar69 - uVar39) {
                    iVar68 = iVar69;
                  }
                  pZVar8[uVar27].off = (uVar55 + 2) - uVar39;
                  pZVar8[uVar27].len = (U32)uVar47;
                  uVar27 = uVar27 + 1;
                  if ((0x1000 < uVar47) ||
                     (uVar56 = uVar47, (ulong *)((long)puVar45 + uVar47) == puVar1)) break;
                }
                puVar36 = (ulong *)(local_118 + (uVar39 & uVar54) * 2);
                if (*(byte *)((long)local_188 + uVar47 + uVar52) < *(byte *)((long)puVar45 + uVar47)
                   ) {
                  *(uint *)local_1c0 = uVar39;
                  if (uVar39 <= uVar49) goto LAB_00217b05;
                  local_1c0 = (ulong *)((long)puVar36 + 4);
                  puVar36 = local_1f8;
                  puVar25 = local_1c0;
                  uVar51 = uVar47;
                }
                else {
                  *(uint *)local_1f8 = uVar39;
                  puVar25 = puVar36;
                  uVar60 = uVar47;
                  if (uVar39 <= uVar49) goto LAB_00217af8;
                }
                bVar63 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if ((bVar63) ||
                   (uVar39 = (uint)*puVar25, local_1f8 = puVar36, iVar69 = iVar68, uVar39 < uVar32))
                break;
              } while( true );
            }
          }
          goto LAB_00217878;
        }
        uVar27 = 0;
        goto LAB_00217c40;
      }
      goto LAB_00218115;
    }
    uVar51 = 0;
LAB_00218115:
    uVar21 = uVar51 & 0xffffffff;
    local_b8 = (U32 *)CONCAT44(local_b8._4_4_,pZVar59[uVar21].price);
    UVar14 = pZVar59[uVar21].off;
    uVar13 = pZVar59[uVar21].mlen;
    local_190 = (ZSTD_optimal_t *)(ulong)pZVar59[uVar21].litlen;
    local_c8 = pZVar59[uVar21].rep[2];
    local_d0 = *(undefined8 *)pZVar59[uVar21].rep;
    uVar27 = pZVar59[uVar21].litlen + uVar13;
    uVar37 = (uint)uVar51 - uVar27;
    if ((uint)uVar51 < uVar27) {
      uVar37 = 0;
    }
LAB_00218173:
    uVar21 = (ulong)uVar37;
    if (uVar13 != 0) goto LAB_00218177;
    *(U32 *)(local_128 + 1) = pZVar59[uVar21].rep[2];
    *local_128 = *(ulong *)pZVar59[uVar21].rep;
    uVar13 = 0;
  }
  uVar37 = (int)uVar21 + 1;
  pZVar59[uVar37].price = (int)local_b8;
  pZVar59[uVar37].off = UVar14;
  pZVar59[uVar37].mlen = uVar13;
  pZVar59[uVar37].litlen = (U32)local_190;
  *(undefined8 *)pZVar59[uVar37].rep = local_d0;
  pZVar59[uVar37].rep[2] = local_c8;
  uVar60 = uVar21;
  puVar45 = local_130;
  if ((int)uVar21 == 0) {
    uVar51 = 1;
    puVar36 = local_130;
    goto LAB_002182e6;
  }
  do {
    uVar51 = uVar60;
    uVar13 = (uint)uVar21;
    uVar27 = pZVar59[uVar21].litlen + pZVar59[uVar21].mlen;
    uVar49 = (uint)uVar51;
    pZVar29 = pZVar59 + uVar21;
    iVar64 = pZVar29->price;
    UVar14 = pZVar29->off;
    UVar17 = pZVar29->mlen;
    UVar43 = pZVar29->litlen;
    pZVar29 = pZVar59 + uVar21;
    UVar15 = pZVar29->rep[0];
    uVar9 = *(undefined8 *)(&pZVar29->litlen + 2);
    pZVar10 = pZVar59 + uVar51;
    pZVar10->litlen = pZVar29->litlen;
    pZVar10->rep[0] = UVar15;
    *(undefined8 *)(&pZVar10->litlen + 2) = uVar9;
    pZVar29 = pZVar59 + uVar51;
    pZVar29->price = iVar64;
    pZVar29->off = UVar14;
    pZVar29->mlen = UVar17;
    pZVar29->litlen = UVar43;
    uVar21 = (ulong)(uVar13 - uVar27);
    if (uVar27 > uVar13) {
      uVar21 = 0;
    }
    uVar60 = (ulong)(uVar49 - 1);
    puVar36 = local_130;
  } while (uVar27 <= uVar13 && uVar13 - uVar27 != 0);
  while (local_130 = puVar36, puVar36 = local_130, uVar49 <= uVar37) {
LAB_002182e6:
    local_130 = puVar45;
    UVar15 = pZVar59[uVar51].mlen;
    uVar13 = pZVar59[uVar51].litlen;
    uVar21 = (ulong)uVar13;
    if (UVar15 == 0) {
      puVar35 = (ulong *)(uVar21 + (long)puVar36);
    }
    else {
      UVar14 = pZVar59[uVar51].off;
      ZSTD_updateStats(poVar2,uVar13,(BYTE *)puVar36,UVar14,UVar15);
      puVar45 = (ulong *)((long)puVar36 + uVar21);
      puVar35 = (ulong *)local_e8->lit;
      if (local_170 < puVar45) {
        puVar25 = puVar35;
        puVar57 = puVar36;
        if (puVar36 <= local_170) {
          puVar25 = (ulong *)((long)puVar35 + ((long)local_170 - (long)puVar36));
          uVar60 = puVar36[1];
          *puVar35 = *puVar36;
          puVar35[1] = uVar60;
          puVar57 = local_170;
          if (0x10 < (long)local_170 - (long)puVar36) {
            lVar20 = 0x10;
            do {
              uVar9 = ((undefined8 *)((long)puVar36 + lVar20))[1];
              puVar4 = (undefined8 *)((long)puVar35 + lVar20);
              *puVar4 = *(undefined8 *)((long)puVar36 + lVar20);
              puVar4[1] = uVar9;
              puVar5 = (undefined8 *)((long)puVar36 + lVar20 + 0x10);
              uVar9 = puVar5[1];
              puVar4[2] = *puVar5;
              puVar4[3] = uVar9;
              lVar20 = lVar20 + 0x20;
            } while (puVar4 + 4 < puVar25);
          }
        }
        if (puVar57 < puVar45) {
          lVar20 = 0;
          do {
            *(BYTE *)((long)puVar25 + lVar20) = *(BYTE *)((long)puVar57 + lVar20);
            lVar20 = lVar20 + 1;
          } while ((long)puVar45 - (long)puVar57 != lVar20);
        }
LAB_0021843d:
        local_e8->lit = local_e8->lit + uVar21;
        psVar24 = local_e8->sequences;
        if (0xffff < uVar13) {
          local_e8->longLengthType = ZSTD_llt_literalLength;
          local_e8->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)local_e8->sequencesStart) >> 3);
        }
      }
      else {
        uVar60 = puVar36[1];
        *puVar35 = *puVar36;
        puVar35[1] = uVar60;
        if (0x10 < uVar13) {
          pBVar61 = local_e8->lit;
          uVar60 = puVar36[3];
          *(ulong *)(pBVar61 + 0x10) = puVar36[2];
          *(ulong *)(pBVar61 + 0x18) = uVar60;
          if (0x10 < uVar21 - 0x10) {
            lVar20 = 0;
            do {
              puVar4 = (undefined8 *)((long)puVar36 + lVar20 + 0x20);
              uVar9 = puVar4[1];
              pBVar3 = pBVar61 + lVar20 + 0x20;
              *(undefined8 *)pBVar3 = *puVar4;
              *(undefined8 *)(pBVar3 + 8) = uVar9;
              puVar4 = (undefined8 *)((long)puVar36 + lVar20 + 0x30);
              uVar9 = puVar4[1];
              *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar3 + 0x18) = uVar9;
              lVar20 = lVar20 + 0x20;
            } while (pBVar3 + 0x20 < pBVar61 + uVar21);
            goto LAB_0021843d;
          }
        }
        local_e8->lit = local_e8->lit + uVar21;
        psVar24 = local_e8->sequences;
      }
      psVar24->litLength = (U16)uVar13;
      psVar24->offset = UVar14 + 1;
      if (0xffff < UVar15 - 3) {
        local_e8->longLengthType = ZSTD_llt_matchLength;
        local_e8->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)local_e8->sequencesStart) >> 3);
      }
      psVar24->matchLength = (U16)(UVar15 - 3);
      local_e8->sequences = psVar24 + 1;
      puVar36 = (ulong *)((long)puVar36 + (ulong)(UVar15 + uVar13));
      puVar35 = puVar36;
    }
    uVar49 = (int)uVar51 + 1;
    uVar51 = (ulong)uVar49;
    puVar45 = local_130;
  }
  ZSTD_setBasePrices(poVar2,2);
LAB_002184dc:
  if (puVar40 <= puVar35) goto LAB_002187a9;
  goto LAB_00214cd4;
LAB_00217af8:
  puVar36 = &local_168;
  goto LAB_00217878;
LAB_00217b05:
  local_1c0 = &local_168;
  puVar36 = local_1f8;
LAB_00217878:
  *(uint *)puVar36 = 0;
  *(uint *)local_1c0 = 0;
  ms->nextToUpdate = iVar68 - 8;
LAB_00217c40:
  local_144 = uVar27;
  ZSTD_optLdm_processMatchCandidate
            ((ZSTD_optLdm_t *)local_98,pZVar8,&local_144,iVar28 - (int)local_e0,(int)puVar1 - iVar28
            );
  if ((ulong)local_144 != 0) {
    uVar13 = pZVar8[local_144 - 1].len;
    if (((uint)local_f0 < uVar13) || (0xfff < uVar13 + iVar64)) {
      UVar15 = 0;
      if (*local_100 == 0) {
        UVar15 = pZVar10->litlen;
      }
      UVar14 = pZVar8[local_144 - 1].off;
      uVar37 = iVar64 - UVar15;
      if (0x1000 < iVar64 - UVar15) {
        uVar37 = 0;
      }
      goto LAB_00218173;
    }
    uVar60 = 0;
    do {
      uVar13 = uVar26;
      if (uVar60 != 0) {
        uVar13 = pZVar8[uVar60 - 1].len + 1;
      }
      uVar37 = pZVar8[uVar60].len;
      if (uVar13 <= uVar37) {
        UVar14 = pZVar8[uVar60].off;
        uVar27 = UVar14 + 1;
        uVar49 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar49 == 0; uVar49 = uVar49 - 1) {
          }
        }
        ZVar6 = (ms->opt).priceType;
        do {
          if (ZVar6 == zop_predef) {
            uVar27 = uVar37 - 2;
            iVar28 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            iVar28 = (uVar27 * 0x100 >> ((byte)iVar28 & 0x1f)) + (iVar28 + uVar49) * 0x100 + 0x1000;
          }
          else {
            uVar27 = uVar37 - 3;
            uVar54 = (ms->opt).offCodeFreq[uVar49] + 1;
            iVar28 = 0x1f;
            if (uVar54 != 0) {
              for (; uVar54 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            if (uVar27 < 0x80) {
              uVar27 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar27];
            }
            else {
              uVar55 = 0x1f;
              if (uVar27 != 0) {
                for (; uVar27 >> uVar55 == 0; uVar55 = uVar55 - 1) {
                }
              }
              uVar27 = (uVar55 ^ 0xffffffe0) + 0x44;
            }
            uVar55 = (ms->opt).matchLengthFreq[uVar27] + 1;
            iVar68 = 0x1f;
            if (uVar55 != 0) {
              for (; uVar55 >> iVar68 == 0; iVar68 = iVar68 + -1) {
              }
            }
            iVar28 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar54 * 0x100 >> ((byte)iVar28 & 0x1f)) +
                     (uVar55 * 0x100 >> ((byte)iVar68 & 0x1f)))) +
                     ((ML_bits[uVar27] + uVar49) - (iVar28 + iVar68)) * 0x100 + 0x33;
          }
          iVar28 = iVar28 + UVar15 + (int)local_198;
          uVar51 = (ulong)(uVar37 + iVar64);
          if ((uint)uVar21 < uVar37 + iVar64) {
            uVar21 = uVar21 & 0xffffffff;
            pZVar29 = local_1a0 + uVar21;
            do {
              uVar21 = uVar21 + 1;
              pZVar29->price = 0x40000000;
              pZVar29 = pZVar29 + 1;
            } while (uVar21 < uVar51);
LAB_00217e10:
            pZVar59[uVar51].mlen = uVar37;
            pZVar59[uVar51].off = UVar14;
            pZVar59[uVar51].litlen = (U32)local_190;
            pZVar59[uVar51].price = iVar28;
          }
          else if (iVar28 < pZVar59[uVar51].price) goto LAB_00217e10;
          uVar37 = uVar37 - 1;
        } while (uVar13 <= uVar37);
      }
      uVar60 = uVar60 + 1;
    } while (uVar60 != local_144);
  }
LAB_00217e61:
  uVar51 = uVar21;
  uVar60 = (ulong)(iVar64 + 1U);
  if ((uint)uVar21 < iVar64 + 1U) goto LAB_00218115;
  goto LAB_00216456;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const curr = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (curr == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}